

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiMBIntersectorK<4,16>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  float *pfVar1;
  undefined4 uVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  __int_type_conflict _Var5;
  long lVar6;
  long lVar7;
  RTCFilterFunctionN p_Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  int iVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [12];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  byte bVar54;
  byte bVar55;
  byte bVar56;
  ulong uVar57;
  uint uVar58;
  ulong uVar59;
  byte bVar60;
  byte bVar61;
  byte bVar62;
  byte bVar63;
  int iVar64;
  long lVar65;
  long lVar66;
  undefined1 uVar67;
  bool bVar68;
  undefined1 uVar69;
  ulong uVar70;
  uint uVar71;
  uint uVar144;
  uint uVar145;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  uint uVar147;
  uint uVar148;
  uint uVar149;
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  uint uVar146;
  uint uVar150;
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  undefined1 auVar142 [64];
  undefined1 auVar143 [64];
  float fVar151;
  float fVar152;
  float fVar175;
  float fVar177;
  vint4 bi_2;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar176;
  float fVar178;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  float fVar179;
  float fVar180;
  float fVar181;
  undefined1 auVar174 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  vint4 bi_1;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  float fVar203;
  float fVar204;
  float fVar222;
  float fVar223;
  vint4 bi;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar224;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  undefined1 auVar221 [64];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [64];
  float fVar245;
  vint4 ai_2;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  vint4 ai_1;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  float fVar251;
  undefined1 auVar250 [64];
  vint4 ai;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  float fVar258;
  float fVar259;
  float fVar260;
  undefined1 auVar257 [32];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [64];
  float fVar268;
  float fVar270;
  float fVar271;
  float fVar272;
  float fVar273;
  undefined1 auVar269 [64];
  float fVar274;
  undefined1 auVar275 [64];
  undefined1 auVar276 [16];
  float fVar278;
  undefined1 auVar277 [32];
  undefined1 auVar279 [64];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [32];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vint<16> mask;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  bool local_c71;
  float local_c00;
  float fStack_bfc;
  float fStack_bf8;
  float fStack_bf4;
  float fStack_bf0;
  float fStack_bec;
  float fStack_be8;
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  RTCFilterFunctionNArguments local_9b0;
  undefined1 local_980 [32];
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [16];
  undefined1 local_8f0 [16];
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_850 [16];
  undefined1 local_840 [16];
  undefined1 local_830 [16];
  float local_820;
  float fStack_81c;
  float fStack_818;
  float fStack_814;
  undefined1 local_810 [16];
  undefined1 local_800 [16];
  undefined1 local_7f0 [16];
  undefined1 local_7e0 [16];
  undefined1 local_7d0 [16];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  Primitive *local_7b0;
  ulong local_7a8;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [64];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_630 [16];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  undefined1 auStack_180 [32];
  float afStack_160 [2];
  int aiStack_158 [74];
  undefined1 auVar136 [32];
  undefined1 auVar283 [64];
  
  PVar3 = prim[1];
  uVar70 = (ulong)(byte)PVar3;
  lVar66 = uVar70 * 0x25;
  fVar268 = *(float *)(prim + lVar66 + 0x12);
  auVar76 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar76 = vinsertps_avx(auVar76,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar75 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar76 = vsubps_avx(auVar76,*(undefined1 (*) [16])(prim + lVar66 + 6));
  auVar225._0_4_ = fVar268 * auVar76._0_4_;
  auVar225._4_4_ = fVar268 * auVar76._4_4_;
  auVar225._8_4_ = fVar268 * auVar76._8_4_;
  auVar225._12_4_ = fVar268 * auVar76._12_4_;
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 4 + 6)));
  auVar153._0_4_ = fVar268 * auVar75._0_4_;
  auVar153._4_4_ = fVar268 * auVar75._4_4_;
  auVar153._8_4_ = fVar268 * auVar75._8_4_;
  auVar153._12_4_ = fVar268 * auVar75._12_4_;
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 5 + 6)));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 6 + 6)));
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0xf + 6)));
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar3 * 0x10 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar70 + 6)));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x1a + 6)));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x1b + 6)));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x1c + 6)));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar246._4_4_ = auVar153._0_4_;
  auVar246._0_4_ = auVar153._0_4_;
  auVar246._8_4_ = auVar153._0_4_;
  auVar246._12_4_ = auVar153._0_4_;
  auVar83 = vshufps_avx(auVar153,auVar153,0x55);
  auVar84 = vshufps_avx(auVar153,auVar153,0xaa);
  fVar268 = auVar84._0_4_;
  auVar205._0_4_ = fVar268 * auVar78._0_4_;
  fVar175 = auVar84._4_4_;
  auVar205._4_4_ = fVar175 * auVar78._4_4_;
  fVar270 = auVar84._8_4_;
  auVar205._8_4_ = fVar270 * auVar78._8_4_;
  fVar271 = auVar84._12_4_;
  auVar205._12_4_ = fVar271 * auVar78._12_4_;
  auVar182._0_4_ = auVar80._0_4_ * fVar268;
  auVar182._4_4_ = auVar80._4_4_ * fVar175;
  auVar182._8_4_ = auVar80._8_4_ * fVar270;
  auVar182._12_4_ = auVar80._12_4_ * fVar271;
  auVar154._0_4_ = auVar81._0_4_ * fVar268;
  auVar154._4_4_ = auVar81._4_4_ * fVar175;
  auVar154._8_4_ = auVar81._8_4_ * fVar270;
  auVar154._12_4_ = auVar81._12_4_ * fVar271;
  auVar84 = vfmadd231ps_fma(auVar205,auVar83,auVar75);
  auVar85 = vfmadd231ps_fma(auVar182,auVar83,auVar16);
  auVar83 = vfmadd231ps_fma(auVar154,auVar77,auVar83);
  auVar22 = vfmadd231ps_fma(auVar84,auVar246,auVar76);
  auVar85 = vfmadd231ps_fma(auVar85,auVar246,auVar79);
  auVar23 = vfmadd231ps_fma(auVar83,auVar82,auVar246);
  auVar284._4_4_ = auVar225._0_4_;
  auVar284._0_4_ = auVar225._0_4_;
  auVar284._8_4_ = auVar225._0_4_;
  auVar284._12_4_ = auVar225._0_4_;
  auVar83 = vshufps_avx(auVar225,auVar225,0x55);
  auVar84 = vshufps_avx(auVar225,auVar225,0xaa);
  fVar268 = auVar84._0_4_;
  auVar247._0_4_ = fVar268 * auVar78._0_4_;
  fVar175 = auVar84._4_4_;
  auVar247._4_4_ = fVar175 * auVar78._4_4_;
  fVar270 = auVar84._8_4_;
  auVar247._8_4_ = fVar270 * auVar78._8_4_;
  fVar271 = auVar84._12_4_;
  auVar247._12_4_ = fVar271 * auVar78._12_4_;
  auVar237._0_4_ = auVar80._0_4_ * fVar268;
  auVar237._4_4_ = auVar80._4_4_ * fVar175;
  auVar237._8_4_ = auVar80._8_4_ * fVar270;
  auVar237._12_4_ = auVar80._12_4_ * fVar271;
  auVar226._0_4_ = auVar81._0_4_ * fVar268;
  auVar226._4_4_ = auVar81._4_4_ * fVar175;
  auVar226._8_4_ = auVar81._8_4_ * fVar270;
  auVar226._12_4_ = auVar81._12_4_ * fVar271;
  auVar75 = vfmadd231ps_fma(auVar247,auVar83,auVar75);
  auVar78 = vfmadd231ps_fma(auVar237,auVar83,auVar16);
  auVar16 = vfmadd231ps_fma(auVar226,auVar83,auVar77);
  auVar24 = vfmadd231ps_fma(auVar75,auVar284,auVar76);
  auVar153 = vfmadd231ps_fma(auVar78,auVar284,auVar79);
  auVar265._8_4_ = 0x7fffffff;
  auVar265._0_8_ = 0x7fffffff7fffffff;
  auVar265._12_4_ = 0x7fffffff;
  auVar154 = vfmadd231ps_fma(auVar16,auVar284,auVar82);
  auVar76 = vandps_avx(auVar265,auVar22);
  auVar261._8_4_ = 0x219392ef;
  auVar261._0_8_ = 0x219392ef219392ef;
  auVar261._12_4_ = 0x219392ef;
  uVar57 = vcmpps_avx512vl(auVar76,auVar261,1);
  bVar68 = (bool)((byte)uVar57 & 1);
  auVar72._0_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar22._0_4_;
  bVar68 = (bool)((byte)(uVar57 >> 1) & 1);
  auVar72._4_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar22._4_4_;
  bVar68 = (bool)((byte)(uVar57 >> 2) & 1);
  auVar72._8_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar22._8_4_;
  bVar68 = (bool)((byte)(uVar57 >> 3) & 1);
  auVar72._12_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar22._12_4_;
  auVar76 = vandps_avx(auVar265,auVar85);
  uVar57 = vcmpps_avx512vl(auVar76,auVar261,1);
  bVar68 = (bool)((byte)uVar57 & 1);
  auVar73._0_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar85._0_4_;
  bVar68 = (bool)((byte)(uVar57 >> 1) & 1);
  auVar73._4_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar85._4_4_;
  bVar68 = (bool)((byte)(uVar57 >> 2) & 1);
  auVar73._8_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar85._8_4_;
  bVar68 = (bool)((byte)(uVar57 >> 3) & 1);
  auVar73._12_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar85._12_4_;
  auVar76 = vandps_avx(auVar265,auVar23);
  uVar57 = vcmpps_avx512vl(auVar76,auVar261,1);
  bVar68 = (bool)((byte)uVar57 & 1);
  auVar74._0_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar23._0_4_;
  bVar68 = (bool)((byte)(uVar57 >> 1) & 1);
  auVar74._4_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar23._4_4_;
  bVar68 = (bool)((byte)(uVar57 >> 2) & 1);
  auVar74._8_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar23._8_4_;
  bVar68 = (bool)((byte)(uVar57 >> 3) & 1);
  auVar74._12_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar23._12_4_;
  auVar75 = vrcp14ps_avx512vl(auVar72);
  auVar262._8_4_ = 0x3f800000;
  auVar262._0_8_ = &DAT_3f8000003f800000;
  auVar262._12_4_ = 0x3f800000;
  auVar76 = vfnmadd213ps_fma(auVar72,auVar75,auVar262);
  auVar22 = vfmadd132ps_fma(auVar76,auVar75,auVar75);
  auVar75 = vrcp14ps_avx512vl(auVar73);
  auVar76 = vfnmadd213ps_fma(auVar73,auVar75,auVar262);
  auVar23 = vfmadd132ps_fma(auVar76,auVar75,auVar75);
  auVar75 = vrcp14ps_avx512vl(auVar74);
  auVar76 = vfnmadd213ps_fma(auVar74,auVar75,auVar262);
  auVar21 = vfmadd132ps_fma(auVar76,auVar75,auVar75);
  fVar268 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar66 + 0x16)) *
            *(float *)(prim + lVar66 + 0x1a);
  auVar252._4_4_ = fVar268;
  auVar252._0_4_ = fVar268;
  auVar252._8_4_ = fVar268;
  auVar252._12_4_ = fVar268;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar70 * 7 + 6);
  auVar76 = vpmovsxwd_avx(auVar76);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar70 * 0xb + 6);
  auVar75 = vpmovsxwd_avx(auVar75);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar79 = vsubps_avx(auVar75,auVar76);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar70 * 9 + 6);
  auVar75 = vpmovsxwd_avx(auVar78);
  auVar78 = vfmadd213ps_fma(auVar79,auVar252,auVar76);
  auVar76 = vcvtdq2ps_avx(auVar75);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar70 * 0xd + 6);
  auVar75 = vpmovsxwd_avx(auVar79);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar79 = vfmadd213ps_fma(auVar75,auVar252,auVar76);
  auVar269 = ZEXT1664(auVar79);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar70 * 0x12 + 6);
  auVar76 = vpmovsxwd_avx(auVar16);
  auVar76 = vcvtdq2ps_avx(auVar76);
  uVar57 = (ulong)(uint)((int)(uVar70 * 5) << 2);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar70 * 2 + uVar57 + 6);
  auVar75 = vpmovsxwd_avx(auVar80);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar16 = vfmadd213ps_fma(auVar75,auVar252,auVar76);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar57 + 6);
  auVar76 = vpmovsxwd_avx(auVar82);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar70 * 0x18 + 6);
  auVar75 = vpmovsxwd_avx(auVar77);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar80 = vfmadd213ps_fma(auVar75,auVar252,auVar76);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar70 * 0x1d + 6);
  auVar76 = vpmovsxwd_avx(auVar81);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar70 + (ulong)(byte)PVar3 * 0x20 + 6);
  auVar75 = vpmovsxwd_avx(auVar83);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar82 = vfmadd213ps_fma(auVar75,auVar252,auVar76);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar3 * 0x20 - uVar70) + 6);
  auVar76 = vpmovsxwd_avx(auVar84);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar70 * 0x23 + 6);
  auVar75 = vpmovsxwd_avx(auVar85);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar75 = vfmadd213ps_fma(auVar75,auVar252,auVar76);
  auVar76 = vsubps_avx(auVar78,auVar24);
  auVar253._0_4_ = auVar22._0_4_ * auVar76._0_4_;
  auVar253._4_4_ = auVar22._4_4_ * auVar76._4_4_;
  auVar253._8_4_ = auVar22._8_4_ * auVar76._8_4_;
  auVar253._12_4_ = auVar22._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar79,auVar24);
  auVar206._0_4_ = auVar22._0_4_ * auVar76._0_4_;
  auVar206._4_4_ = auVar22._4_4_ * auVar76._4_4_;
  auVar206._8_4_ = auVar22._8_4_ * auVar76._8_4_;
  auVar206._12_4_ = auVar22._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar16,auVar153);
  auVar248._0_4_ = auVar23._0_4_ * auVar76._0_4_;
  auVar248._4_4_ = auVar23._4_4_ * auVar76._4_4_;
  auVar248._8_4_ = auVar23._8_4_ * auVar76._8_4_;
  auVar248._12_4_ = auVar23._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar80,auVar153);
  auVar183._0_4_ = auVar23._0_4_ * auVar76._0_4_;
  auVar183._4_4_ = auVar23._4_4_ * auVar76._4_4_;
  auVar183._8_4_ = auVar23._8_4_ * auVar76._8_4_;
  auVar183._12_4_ = auVar23._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar82,auVar154);
  auVar238._0_4_ = auVar21._0_4_ * auVar76._0_4_;
  auVar238._4_4_ = auVar21._4_4_ * auVar76._4_4_;
  auVar238._8_4_ = auVar21._8_4_ * auVar76._8_4_;
  auVar238._12_4_ = auVar21._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar75,auVar154);
  auVar155._0_4_ = auVar21._0_4_ * auVar76._0_4_;
  auVar155._4_4_ = auVar21._4_4_ * auVar76._4_4_;
  auVar155._8_4_ = auVar21._8_4_ * auVar76._8_4_;
  auVar155._12_4_ = auVar21._12_4_ * auVar76._12_4_;
  auVar76 = vpminsd_avx(auVar253,auVar206);
  auVar75 = vpminsd_avx(auVar248,auVar183);
  auVar76 = vmaxps_avx(auVar76,auVar75);
  auVar75 = vpminsd_avx(auVar238,auVar155);
  uVar2 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar22._4_4_ = uVar2;
  auVar22._0_4_ = uVar2;
  auVar22._8_4_ = uVar2;
  auVar22._12_4_ = uVar2;
  auVar75 = vmaxps_avx512vl(auVar75,auVar22);
  auVar76 = vmaxps_avx(auVar76,auVar75);
  auVar23._8_4_ = 0x3f7ffffa;
  auVar23._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar23._12_4_ = 0x3f7ffffa;
  local_630 = vmulps_avx512vl(auVar76,auVar23);
  auVar76 = vpmaxsd_avx(auVar253,auVar206);
  auVar75 = vpmaxsd_avx(auVar248,auVar183);
  auVar76 = vminps_avx(auVar76,auVar75);
  auVar75 = vpmaxsd_avx(auVar238,auVar155);
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar21._4_4_ = uVar2;
  auVar21._0_4_ = uVar2;
  auVar21._8_4_ = uVar2;
  auVar21._12_4_ = uVar2;
  auVar75 = vminps_avx512vl(auVar75,auVar21);
  auVar76 = vminps_avx(auVar76,auVar75);
  auVar24._8_4_ = 0x3f800003;
  auVar24._0_8_ = 0x3f8000033f800003;
  auVar24._12_4_ = 0x3f800003;
  auVar76 = vmulps_avx512vl(auVar76,auVar24);
  auVar75 = vpbroadcastd_avx512vl();
  uVar17 = vcmpps_avx512vl(local_630,auVar76,2);
  local_7a8 = vpcmpgtd_avx512vl(auVar75,_DAT_01ff0cf0);
  local_7a8 = ((byte)uVar17 & 0xf) & local_7a8;
  bVar68 = (char)local_7a8 == '\0';
  local_c71 = !bVar68;
  if (bVar68) {
    return local_c71;
  }
  auVar174 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_4c0 = vmovdqa64_avx512f(auVar174);
  local_7b0 = prim;
LAB_01c412ad:
  lVar66 = 0;
  for (uVar57 = local_7a8; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x8000000000000000) {
    lVar66 = lVar66 + 1;
  }
  uVar58 = *(uint *)(local_7b0 + 2);
  pGVar4 = (context->scene->geometries).items[uVar58].ptr;
  uVar57 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           (ulong)*(uint *)(local_7b0 + lVar66 * 4 + 6) *
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar268 = (pGVar4->time_range).lower;
  fVar268 = pGVar4->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x1c0) - fVar268) / ((pGVar4->time_range).upper - fVar268));
  auVar76 = vroundss_avx(ZEXT416((uint)fVar268),ZEXT416((uint)fVar268),9);
  auVar76 = vminss_avx(auVar76,ZEXT416((uint)(pGVar4->fnumTimeSegments + -1.0)));
  auVar76 = vmaxss_avx(ZEXT816(0) << 0x20,auVar76);
  fVar268 = fVar268 - auVar76._0_4_;
  _Var5 = pGVar4[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar65 = (long)(int)auVar76._0_4_ * 0x38;
  lVar66 = *(long *)(_Var5 + 0x10 + lVar65);
  lVar6 = *(long *)(_Var5 + 0x38 + lVar65);
  lVar7 = *(long *)(_Var5 + 0x48 + lVar65);
  pfVar1 = (float *)(lVar6 + uVar57 * lVar7);
  auVar156._0_4_ = fVar268 * *pfVar1;
  auVar156._4_4_ = fVar268 * pfVar1[1];
  auVar156._8_4_ = fVar268 * pfVar1[2];
  auVar156._12_4_ = fVar268 * pfVar1[3];
  pfVar1 = (float *)(lVar6 + (uVar57 + 1) * lVar7);
  auVar184._0_4_ = fVar268 * *pfVar1;
  auVar184._4_4_ = fVar268 * pfVar1[1];
  auVar184._8_4_ = fVar268 * pfVar1[2];
  auVar184._12_4_ = fVar268 * pfVar1[3];
  pfVar1 = (float *)(lVar6 + (uVar57 + 2) * lVar7);
  auVar207._0_4_ = fVar268 * *pfVar1;
  auVar207._4_4_ = fVar268 * pfVar1[1];
  auVar207._8_4_ = fVar268 * pfVar1[2];
  auVar207._12_4_ = fVar268 * pfVar1[3];
  pfVar1 = (float *)(lVar6 + lVar7 * (uVar57 + 3));
  auVar227._0_4_ = fVar268 * *pfVar1;
  auVar227._4_4_ = fVar268 * pfVar1[1];
  auVar227._8_4_ = fVar268 * pfVar1[2];
  auVar227._12_4_ = fVar268 * pfVar1[3];
  lVar6 = *(long *)(_Var5 + lVar65);
  fVar268 = 1.0 - fVar268;
  auVar239._4_4_ = fVar268;
  auVar239._0_4_ = fVar268;
  auVar239._8_4_ = fVar268;
  auVar239._12_4_ = fVar268;
  auVar78 = vfmadd231ps_fma(auVar156,auVar239,*(undefined1 (*) [16])(lVar6 + lVar66 * uVar57));
  auVar79 = vfmadd231ps_fma(auVar184,auVar239,*(undefined1 (*) [16])(lVar6 + lVar66 * (uVar57 + 1)))
  ;
  auVar16 = vfmadd231ps_fma(auVar207,auVar239,*(undefined1 (*) [16])(lVar6 + lVar66 * (uVar57 + 2)))
  ;
  auVar80 = vfmadd231ps_fma(auVar227,auVar239,*(undefined1 (*) [16])(lVar6 + lVar66 * (uVar57 + 3)))
  ;
  auVar76 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar75 = vinsertps_avx(auVar76,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar280._4_4_ = uVar2;
  auVar280._0_4_ = uVar2;
  auVar280._8_4_ = uVar2;
  auVar280._12_4_ = uVar2;
  local_720._16_4_ = uVar2;
  local_720._0_16_ = auVar280;
  local_720._20_4_ = uVar2;
  local_720._24_4_ = uVar2;
  local_720._28_4_ = uVar2;
  auVar283 = ZEXT3264(local_720);
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x140);
  auVar285._4_4_ = uVar2;
  auVar285._0_4_ = uVar2;
  auVar285._8_4_ = uVar2;
  auVar285._12_4_ = uVar2;
  local_740._16_4_ = uVar2;
  local_740._0_16_ = auVar285;
  local_740._20_4_ = uVar2;
  local_740._24_4_ = uVar2;
  local_740._28_4_ = uVar2;
  auVar76 = vunpcklps_avx(auVar280,auVar285);
  fVar268 = *(float *)(ray + k * 4 + 0x180);
  auVar286._4_4_ = fVar268;
  auVar286._0_4_ = fVar268;
  auVar286._8_4_ = fVar268;
  auVar286._12_4_ = fVar268;
  local_760._16_4_ = fVar268;
  local_760._0_16_ = auVar286;
  local_760._20_4_ = fVar268;
  local_760._24_4_ = fVar268;
  local_760._28_4_ = fVar268;
  local_8f0 = vinsertps_avx(auVar76,auVar286,0x28);
  auVar275 = ZEXT1664(local_8f0);
  auVar249._0_4_ = auVar78._0_4_ + auVar79._0_4_ + auVar16._0_4_ + auVar80._0_4_;
  auVar249._4_4_ = auVar78._4_4_ + auVar79._4_4_ + auVar16._4_4_ + auVar80._4_4_;
  auVar249._8_4_ = auVar78._8_4_ + auVar79._8_4_ + auVar16._8_4_ + auVar80._8_4_;
  auVar249._12_4_ = auVar78._12_4_ + auVar79._12_4_ + auVar16._12_4_ + auVar80._12_4_;
  auVar25._8_4_ = 0x3e800000;
  auVar25._0_8_ = 0x3e8000003e800000;
  auVar25._12_4_ = 0x3e800000;
  auVar76 = vmulps_avx512vl(auVar249,auVar25);
  auVar76 = vsubps_avx(auVar76,auVar75);
  auVar76 = vdpps_avx(auVar76,local_8f0,0x7f);
  fVar175 = *(float *)(ray + k * 4 + 0xc0);
  local_900 = vdpps_avx(local_8f0,local_8f0,0x7f);
  auVar279 = ZEXT1664(local_900);
  auVar174 = vpbroadcastd_avx512f();
  local_440 = vmovdqa64_avx512f(auVar174);
  auVar254._4_12_ = ZEXT812(0) << 0x20;
  auVar254._0_4_ = local_900._0_4_;
  auVar77 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar254);
  auVar82 = vfnmadd213ss_fma(auVar77,local_900,ZEXT416(0x40000000));
  local_540 = auVar76._0_4_ * auVar77._0_4_ * auVar82._0_4_;
  auVar250 = ZEXT464((uint)local_540);
  auVar255._4_4_ = local_540;
  auVar255._0_4_ = local_540;
  auVar255._8_4_ = local_540;
  auVar255._12_4_ = local_540;
  fStack_950 = local_540;
  _local_960 = auVar255;
  fStack_94c = local_540;
  fStack_948 = local_540;
  fStack_944 = local_540;
  auVar76 = vfmadd231ps_fma(auVar75,local_8f0,auVar255);
  auVar76 = vblendps_avx(auVar76,ZEXT816(0) << 0x40,8);
  auVar75 = vsubps_avx(auVar78,auVar76);
  auVar78 = vsubps_avx(auVar16,auVar76);
  auVar79 = vsubps_avx(auVar79,auVar76);
  auVar267 = ZEXT1664(auVar79);
  auVar76 = vsubps_avx(auVar80,auVar76);
  auVar236 = ZEXT3264(_DAT_02020f20);
  auVar86 = vbroadcastss_avx512vl(auVar75);
  auVar104._8_4_ = 1;
  auVar104._0_8_ = 0x100000001;
  auVar104._12_4_ = 1;
  auVar104._16_4_ = 1;
  auVar104._20_4_ = 1;
  auVar104._24_4_ = 1;
  auVar104._28_4_ = 1;
  local_880 = ZEXT1632(auVar75);
  auVar87 = vpermps_avx512vl(auVar104,local_880);
  auVar96._8_4_ = 2;
  auVar96._0_8_ = 0x200000002;
  auVar96._12_4_ = 2;
  auVar96._16_4_ = 2;
  auVar96._20_4_ = 2;
  auVar96._24_4_ = 2;
  auVar96._28_4_ = 2;
  auVar88 = vpermps_avx512vl(auVar96,local_880);
  auVar97._8_4_ = 3;
  auVar97._0_8_ = 0x300000003;
  auVar97._12_4_ = 3;
  auVar97._16_4_ = 3;
  auVar97._20_4_ = 3;
  auVar97._24_4_ = 3;
  auVar97._28_4_ = 3;
  auVar89 = vpermps_avx512vl(auVar97,local_880);
  auVar90 = vbroadcastss_avx512vl(auVar79);
  local_8c0 = ZEXT1632(auVar79);
  auVar140._0_32_ = vpermps_avx512vl(auVar104,local_8c0);
  auVar91 = vpermps_avx512vl(auVar96,local_8c0);
  auVar141._0_32_ = vpermps_avx512vl(auVar97,local_8c0);
  auVar92 = vbroadcastss_avx512vl(auVar78);
  local_8a0 = ZEXT1632(auVar78);
  auVar93 = vpermps_avx512vl(auVar104,local_8a0);
  auVar94 = vpermps_avx512vl(auVar96,local_8a0);
  auVar95 = vpermps_avx512vl(auVar97,local_8a0);
  local_980 = vbroadcastss_avx512vl(auVar76);
  auVar288 = ZEXT3264(local_980);
  _local_8e0 = ZEXT1632(auVar76);
  auVar139._0_32_ = vpermps_avx512vl(auVar104,_local_8e0);
  local_600 = vpermps_avx512vl(auVar96,_local_8e0);
  local_580 = vpermps_avx2(auVar97,_local_8e0);
  auVar221 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  auVar76 = vfmadd231ps_fma(ZEXT432((uint)(fVar268 * fVar268)),local_740,local_740);
  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),local_720,local_720);
  local_520._0_4_ = auVar76._0_4_;
  local_520._4_4_ = local_520._0_4_;
  local_520._8_4_ = local_520._0_4_;
  local_520._12_4_ = local_520._0_4_;
  local_520._16_4_ = local_520._0_4_;
  local_520._20_4_ = local_520._0_4_;
  local_520._24_4_ = local_520._0_4_;
  local_520._28_4_ = local_520._0_4_;
  auVar135._8_4_ = 0x7fffffff;
  auVar135._0_8_ = 0x7fffffff7fffffff;
  auVar135._12_4_ = 0x7fffffff;
  auVar135._16_4_ = 0x7fffffff;
  auVar135._20_4_ = 0x7fffffff;
  auVar135._24_4_ = 0x7fffffff;
  auVar135._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_520,auVar135);
  local_830 = ZEXT416((uint)local_540);
  local_540 = fVar175 - local_540;
  fStack_53c = local_540;
  fStack_538 = local_540;
  fStack_534 = local_540;
  fStack_530 = local_540;
  fStack_52c = local_540;
  fStack_528 = local_540;
  fStack_524 = local_540;
  bVar62 = 0;
  iVar64 = 1;
  auVar174 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar174);
  auVar76 = vsqrtss_avx(local_900,local_900);
  auVar75 = vsqrtss_avx(local_900,local_900);
  local_850 = ZEXT816(0x3f80000000000000);
  auVar135 = auVar174._32_32_;
  local_560 = local_600;
  uVar57 = 0;
  do {
    auVar78 = vmovshdup_avx(local_850);
    fVar268 = local_850._0_4_;
    fVar278 = auVar78._0_4_ - fVar268;
    fVar260 = fVar278 * 0.04761905;
    auVar242._4_4_ = fVar268;
    auVar242._0_4_ = fVar268;
    auVar242._8_4_ = fVar268;
    auVar242._12_4_ = fVar268;
    auVar242._16_4_ = fVar268;
    auVar242._20_4_ = fVar268;
    auVar242._24_4_ = fVar268;
    auVar242._28_4_ = fVar268;
    local_920._4_4_ = fVar278;
    local_920._0_4_ = fVar278;
    local_920._8_4_ = fVar278;
    local_920._12_4_ = fVar278;
    local_920._16_4_ = fVar278;
    local_920._20_4_ = fVar278;
    local_920._24_4_ = fVar278;
    local_920._28_4_ = fVar278;
    auVar78 = vfmadd231ps_fma(auVar242,local_920,auVar236._0_32_);
    auVar104 = vsubps_avx(auVar221._0_32_,ZEXT1632(auVar78));
    fVar268 = auVar104._0_4_;
    fVar271 = auVar104._4_4_;
    fVar258 = auVar104._8_4_;
    fVar273 = auVar104._12_4_;
    fVar274 = auVar104._16_4_;
    fVar245 = auVar104._20_4_;
    fVar204 = auVar104._24_4_;
    fVar151 = fVar268 * fVar268 * fVar268;
    fVar176 = fVar271 * fVar271 * fVar271;
    auVar99._4_4_ = fVar176;
    auVar99._0_4_ = fVar151;
    fVar177 = fVar258 * fVar258 * fVar258;
    auVar99._8_4_ = fVar177;
    fVar178 = fVar273 * fVar273 * fVar273;
    auVar99._12_4_ = fVar178;
    fVar179 = fVar274 * fVar274 * fVar274;
    auVar99._16_4_ = fVar179;
    fVar180 = fVar245 * fVar245 * fVar245;
    auVar99._20_4_ = fVar180;
    fVar181 = fVar204 * fVar204 * fVar204;
    auVar99._24_4_ = fVar181;
    auVar99._28_4_ = fVar278;
    auVar96 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar97 = vmulps_avx512vl(auVar99,auVar96);
    fVar270 = auVar78._0_4_;
    fVar272 = auVar78._4_4_;
    fVar259 = auVar78._8_4_;
    fVar152 = auVar78._12_4_;
    fVar203 = fVar270 * fVar270 * fVar270;
    fVar222 = fVar272 * fVar272 * fVar272;
    fVar223 = fVar259 * fVar259 * fVar259;
    fVar224 = fVar152 * fVar152 * fVar152;
    auVar174._28_36_ = auVar221._28_36_;
    auVar174._0_28_ = ZEXT1628(CONCAT412(fVar224,CONCAT48(fVar223,CONCAT44(fVar222,fVar203))));
    auVar221._0_4_ = fVar270 * fVar268;
    auVar221._4_4_ = fVar272 * fVar271;
    auVar221._8_4_ = fVar259 * fVar258;
    auVar221._12_4_ = fVar152 * fVar273;
    auVar221._16_4_ = fVar274 * 0.0;
    auVar221._20_4_ = fVar245 * 0.0;
    auVar221._28_36_ = auVar275._28_36_;
    auVar221._24_4_ = fVar204 * 0.0;
    auVar96 = vmulps_avx512vl(auVar174._0_32_,auVar96);
    fVar278 = auVar96._28_4_ + fVar278;
    fVar251 = fVar278 + auVar279._28_4_ + auVar250._28_4_;
    auVar105._4_4_ = fVar176 * 0.16666667;
    auVar105._0_4_ = fVar151 * 0.16666667;
    auVar105._8_4_ = fVar177 * 0.16666667;
    auVar105._12_4_ = fVar178 * 0.16666667;
    auVar105._16_4_ = fVar179 * 0.16666667;
    auVar105._20_4_ = fVar180 * 0.16666667;
    auVar105._24_4_ = fVar181 * 0.16666667;
    auVar105._28_4_ = fVar278;
    auVar100._4_4_ =
         (auVar221._4_4_ * fVar271 * 12.0 + auVar221._4_4_ * fVar272 * 6.0 + fVar222 + auVar97._4_4_
         ) * 0.16666667;
    auVar100._0_4_ =
         (auVar221._0_4_ * fVar268 * 12.0 + auVar221._0_4_ * fVar270 * 6.0 + fVar203 + auVar97._0_4_
         ) * 0.16666667;
    auVar100._8_4_ =
         (auVar221._8_4_ * fVar258 * 12.0 + auVar221._8_4_ * fVar259 * 6.0 + fVar223 + auVar97._8_4_
         ) * 0.16666667;
    auVar100._12_4_ =
         (auVar221._12_4_ * fVar273 * 12.0 + auVar221._12_4_ * fVar152 * 6.0 +
         fVar224 + auVar97._12_4_) * 0.16666667;
    auVar100._16_4_ =
         (auVar221._16_4_ * fVar274 * 12.0 + auVar221._16_4_ * 0.0 * 6.0 + auVar97._16_4_ + 0.0) *
         0.16666667;
    auVar100._20_4_ =
         (auVar221._20_4_ * fVar245 * 12.0 + auVar221._20_4_ * 0.0 * 6.0 + auVar97._20_4_ + 0.0) *
         0.16666667;
    auVar100._24_4_ =
         (auVar221._24_4_ * fVar204 * 12.0 + auVar221._24_4_ * 0.0 * 6.0 + auVar97._24_4_ + 0.0) *
         0.16666667;
    auVar100._28_4_ = auVar279._28_4_;
    auVar101._4_4_ =
         (auVar96._4_4_ + fVar176 + auVar221._4_4_ * fVar272 * 12.0 + auVar221._4_4_ * fVar271 * 6.0
         ) * 0.16666667;
    auVar101._0_4_ =
         (auVar96._0_4_ + fVar151 + auVar221._0_4_ * fVar270 * 12.0 + auVar221._0_4_ * fVar268 * 6.0
         ) * 0.16666667;
    auVar101._8_4_ =
         (auVar96._8_4_ + fVar177 + auVar221._8_4_ * fVar259 * 12.0 + auVar221._8_4_ * fVar258 * 6.0
         ) * 0.16666667;
    auVar101._12_4_ =
         (auVar96._12_4_ + fVar178 +
         auVar221._12_4_ * fVar152 * 12.0 + auVar221._12_4_ * fVar273 * 6.0) * 0.16666667;
    auVar101._16_4_ =
         (auVar96._16_4_ + fVar179 + auVar221._16_4_ * 0.0 * 12.0 + auVar221._16_4_ * fVar274 * 6.0)
         * 0.16666667;
    auVar101._20_4_ =
         (auVar96._20_4_ + fVar180 + auVar221._20_4_ * 0.0 * 12.0 + auVar221._20_4_ * fVar245 * 6.0)
         * 0.16666667;
    auVar101._24_4_ =
         (auVar96._24_4_ + fVar181 + auVar221._24_4_ * 0.0 * 12.0 + auVar221._24_4_ * fVar204 * 6.0)
         * 0.16666667;
    auVar101._28_4_ = auVar283._28_4_;
    auVar102._28_4_ = fVar251;
    auVar102._0_28_ =
         ZEXT1628(CONCAT412(fVar224 * 0.16666667,
                            CONCAT48(fVar223 * 0.16666667,
                                     CONCAT44(fVar222 * 0.16666667,fVar203 * 0.16666667))));
    auVar96 = vmulps_avx512vl(auVar288._0_32_,auVar102);
    auVar97 = vmulps_avx512vl(auVar139._0_32_,auVar102);
    auVar98 = vmulps_avx512vl(local_560,auVar102);
    auVar107._4_4_ = local_580._4_4_ * fVar222 * 0.16666667;
    auVar107._0_4_ = local_580._0_4_ * fVar203 * 0.16666667;
    auVar107._8_4_ = local_580._8_4_ * fVar223 * 0.16666667;
    auVar107._12_4_ = local_580._12_4_ * fVar224 * 0.16666667;
    auVar107._16_4_ = local_580._16_4_ * 0.0;
    auVar107._20_4_ = local_580._20_4_ * 0.0;
    auVar107._24_4_ = local_580._24_4_ * 0.0;
    auVar107._28_4_ = fVar251;
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar101,auVar92);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar101,auVar93);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar101,auVar94);
    auVar99 = vfmadd231ps_avx512vl(auVar107,auVar95,auVar101);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar100,auVar90);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar100,auVar140._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar100,auVar91);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar141._0_32_,auVar100);
    auVar100 = vfmadd231ps_avx512vl(auVar96,auVar105,auVar86);
    auVar101 = vfmadd231ps_avx512vl(auVar97,auVar105,auVar87);
    auVar102 = vfmadd231ps_avx512vl(auVar98,auVar105,auVar88);
    auVar97 = vfmadd231ps_avx512vl(auVar99,auVar89,auVar105);
    auVar96 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar99 = vxorps_avx512vl(auVar104,auVar96);
    auVar103 = vxorps_avx512vl(ZEXT1632(auVar78),auVar96);
    auVar121._0_4_ = auVar103._0_4_ * fVar270;
    auVar121._4_4_ = auVar103._4_4_ * fVar272;
    auVar121._8_4_ = auVar103._8_4_ * fVar259;
    auVar121._12_4_ = auVar103._12_4_ * fVar152;
    auVar121._16_4_ = auVar103._16_4_ * 0.0;
    auVar121._20_4_ = auVar103._20_4_ * 0.0;
    auVar121._24_4_ = auVar103._24_4_ * 0.0;
    auVar121._28_4_ = 0;
    auVar98._8_4_ = 0x40800000;
    auVar98._0_8_ = 0x4080000040800000;
    auVar98._12_4_ = 0x40800000;
    auVar98._16_4_ = 0x40800000;
    auVar98._20_4_ = 0x40800000;
    auVar98._24_4_ = 0x40800000;
    auVar98._28_4_ = 0x40800000;
    auVar98 = vmulps_avx512vl(auVar221._0_32_,auVar98);
    auVar96 = vsubps_avx(auVar121,auVar98);
    auVar108._4_4_ = auVar99._4_4_ * fVar271 * 0.5;
    auVar108._0_4_ = auVar99._0_4_ * fVar268 * 0.5;
    auVar108._8_4_ = auVar99._8_4_ * fVar258 * 0.5;
    auVar108._12_4_ = auVar99._12_4_ * fVar273 * 0.5;
    auVar108._16_4_ = auVar99._16_4_ * fVar274 * 0.5;
    auVar108._20_4_ = auVar99._20_4_ * fVar245 * 0.5;
    auVar108._24_4_ = auVar99._24_4_ * fVar204 * 0.5;
    auVar108._28_4_ = auVar104._28_4_;
    auVar109._4_4_ = auVar96._4_4_ * 0.5;
    auVar109._0_4_ = auVar96._0_4_ * 0.5;
    auVar109._8_4_ = auVar96._8_4_ * 0.5;
    auVar109._12_4_ = auVar96._12_4_ * 0.5;
    auVar109._16_4_ = auVar96._16_4_ * 0.5;
    auVar109._20_4_ = auVar96._20_4_ * 0.5;
    auVar109._24_4_ = auVar96._24_4_ * 0.5;
    auVar109._28_4_ = auVar96._28_4_;
    auVar110._4_4_ = (fVar271 * fVar271 + auVar98._4_4_) * 0.5;
    auVar110._0_4_ = (fVar268 * fVar268 + auVar98._0_4_) * 0.5;
    auVar110._8_4_ = (fVar258 * fVar258 + auVar98._8_4_) * 0.5;
    auVar110._12_4_ = (fVar273 * fVar273 + auVar98._12_4_) * 0.5;
    auVar110._16_4_ = (fVar274 * fVar274 + auVar98._16_4_) * 0.5;
    auVar110._20_4_ = (fVar245 * fVar245 + auVar98._20_4_) * 0.5;
    auVar110._24_4_ = (fVar204 * fVar204 + auVar98._24_4_) * 0.5;
    auVar110._28_4_ = auVar267._28_4_ + auVar98._28_4_;
    fVar268 = fVar270 * fVar270 * 0.5;
    fVar270 = fVar272 * fVar272 * 0.5;
    fVar271 = fVar259 * fVar259 * 0.5;
    fVar272 = fVar152 * fVar152 * 0.5;
    auVar115._28_4_ = auVar269._28_4_;
    auVar115._0_28_ = ZEXT1628(CONCAT412(fVar272,CONCAT48(fVar271,CONCAT44(fVar270,fVar268))));
    auVar104 = vmulps_avx512vl(auVar288._0_32_,auVar115);
    auVar96 = vmulps_avx512vl(auVar139._0_32_,auVar115);
    auVar98 = vmulps_avx512vl(local_560,auVar115);
    auVar116._4_4_ = fVar270 * local_580._4_4_;
    auVar116._0_4_ = fVar268 * local_580._0_4_;
    auVar116._8_4_ = fVar271 * local_580._8_4_;
    auVar116._12_4_ = fVar272 * local_580._12_4_;
    auVar116._16_4_ = local_580._16_4_ * 0.0;
    auVar116._20_4_ = local_580._20_4_ * 0.0;
    auVar116._24_4_ = local_580._24_4_ * 0.0;
    auVar116._28_4_ = auVar269._28_4_;
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar110,auVar92);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar110,auVar93);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar110,auVar94);
    auVar99 = vfmadd231ps_avx512vl(auVar116,auVar95,auVar110);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar109,auVar90);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar109,auVar140._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar109,auVar91);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar141._0_32_,auVar109);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar108,auVar86);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar108,auVar87);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar108,auVar88);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar89,auVar108);
    auVar125._4_4_ = auVar104._4_4_ * fVar260;
    auVar125._0_4_ = auVar104._0_4_ * fVar260;
    auVar125._8_4_ = auVar104._8_4_ * fVar260;
    auVar125._12_4_ = auVar104._12_4_ * fVar260;
    auVar125._16_4_ = auVar104._16_4_ * fVar260;
    auVar125._20_4_ = auVar104._20_4_ * fVar260;
    auVar125._24_4_ = auVar104._24_4_ * fVar260;
    auVar125._28_4_ = auVar103._28_4_;
    auVar126._4_4_ = auVar96._4_4_ * fVar260;
    auVar126._0_4_ = auVar96._0_4_ * fVar260;
    auVar126._8_4_ = auVar96._8_4_ * fVar260;
    auVar126._12_4_ = auVar96._12_4_ * fVar260;
    auVar126._16_4_ = auVar96._16_4_ * fVar260;
    auVar126._20_4_ = auVar96._20_4_ * fVar260;
    auVar126._24_4_ = auVar96._24_4_ * fVar260;
    auVar126._28_4_ = auVar96._28_4_;
    auVar279 = ZEXT3264(auVar126);
    auVar127._4_4_ = auVar98._4_4_ * fVar260;
    auVar127._0_4_ = auVar98._0_4_ * fVar260;
    auVar127._8_4_ = auVar98._8_4_ * fVar260;
    auVar127._12_4_ = auVar98._12_4_ * fVar260;
    auVar127._16_4_ = auVar98._16_4_ * fVar260;
    auVar127._20_4_ = auVar98._20_4_ * fVar260;
    auVar127._24_4_ = auVar98._24_4_ * fVar260;
    auVar127._28_4_ = auVar98._28_4_;
    auVar283 = ZEXT3264(auVar127);
    fVar268 = auVar99._0_4_ * fVar260;
    fVar270 = auVar99._4_4_ * fVar260;
    auVar117._4_4_ = fVar270;
    auVar117._0_4_ = fVar268;
    fVar271 = auVar99._8_4_ * fVar260;
    auVar117._8_4_ = fVar271;
    fVar272 = auVar99._12_4_ * fVar260;
    auVar117._12_4_ = fVar272;
    fVar258 = auVar99._16_4_ * fVar260;
    auVar117._16_4_ = fVar258;
    fVar259 = auVar99._20_4_ * fVar260;
    auVar117._20_4_ = fVar259;
    fVar260 = auVar99._24_4_ * fVar260;
    auVar117._24_4_ = fVar260;
    auVar117._28_4_ = local_580._28_4_;
    auVar78 = vxorps_avx512vl(auVar139._0_16_,auVar139._0_16_);
    auVar105 = vpermt2ps_avx512vl(auVar100,_DAT_0205fd20,ZEXT1632(auVar78));
    auVar267 = ZEXT3264(auVar105);
    auVar106 = vpermt2ps_avx512vl(auVar101,_DAT_0205fd20,ZEXT1632(auVar78));
    auVar98 = ZEXT1632(auVar78);
    auVar107 = vpermt2ps_avx512vl(auVar102,_DAT_0205fd20,auVar98);
    auVar122._0_4_ = fVar268 + auVar97._0_4_;
    auVar122._4_4_ = fVar270 + auVar97._4_4_;
    auVar122._8_4_ = fVar271 + auVar97._8_4_;
    auVar122._12_4_ = fVar272 + auVar97._12_4_;
    auVar122._16_4_ = fVar258 + auVar97._16_4_;
    auVar122._20_4_ = fVar259 + auVar97._20_4_;
    auVar122._24_4_ = fVar260 + auVar97._24_4_;
    auVar122._28_4_ = local_580._28_4_ + auVar97._28_4_;
    auVar104 = vmaxps_avx(auVar97,auVar122);
    auVar96 = vminps_avx(auVar97,auVar122);
    auVar103 = vpermt2ps_avx512vl(auVar97,_DAT_0205fd20,auVar98);
    auVar108 = vpermt2ps_avx512vl(auVar125,_DAT_0205fd20,auVar98);
    auVar109 = vpermt2ps_avx512vl(auVar126,_DAT_0205fd20,auVar98);
    auVar122 = ZEXT1632(auVar78);
    auVar110 = vpermt2ps_avx512vl(auVar127,_DAT_0205fd20,auVar122);
    auVar97 = vpermt2ps_avx512vl(auVar117,_DAT_0205fd20,auVar122);
    auVar111 = vsubps_avx512vl(auVar103,auVar97);
    auVar97 = vsubps_avx(auVar105,auVar100);
    auVar98 = vsubps_avx(auVar106,auVar101);
    auVar99 = vsubps_avx(auVar107,auVar102);
    auVar250 = ZEXT3264(auVar99);
    auVar112 = vmulps_avx512vl(auVar98,auVar127);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar126,auVar99);
    auVar113 = vmulps_avx512vl(auVar99,auVar125);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar127,auVar97);
    auVar114 = vmulps_avx512vl(auVar97,auVar126);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar125,auVar98);
    auVar114 = vmulps_avx512vl(auVar114,auVar114);
    auVar113 = vfmadd231ps_avx512vl(auVar114,auVar113,auVar113);
    auVar112 = vfmadd231ps_avx512vl(auVar113,auVar112,auVar112);
    auVar113 = vmulps_avx512vl(auVar99,auVar99);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar98,auVar98);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar97,auVar97);
    auVar114 = vrcp14ps_avx512vl(auVar113);
    auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar116 = vfnmadd213ps_avx512vl(auVar114,auVar113,auVar115);
    auVar114 = vfmadd132ps_avx512vl(auVar116,auVar114,auVar114);
    auVar112 = vmulps_avx512vl(auVar112,auVar114);
    auVar116 = vmulps_avx512vl(auVar98,auVar110);
    auVar116 = vfmsub231ps_avx512vl(auVar116,auVar109,auVar99);
    auVar117 = vmulps_avx512vl(auVar99,auVar108);
    auVar117 = vfmsub231ps_avx512vl(auVar117,auVar110,auVar97);
    auVar118 = vmulps_avx512vl(auVar97,auVar109);
    auVar118 = vfmsub231ps_avx512vl(auVar118,auVar108,auVar98);
    auVar118 = vmulps_avx512vl(auVar118,auVar118);
    auVar117 = vfmadd231ps_avx512vl(auVar118,auVar117,auVar117);
    auVar116 = vfmadd231ps_avx512vl(auVar117,auVar116,auVar116);
    auVar114 = vmulps_avx512vl(auVar116,auVar114);
    auVar112 = vmaxps_avx512vl(auVar112,auVar114);
    auVar112 = vsqrtps_avx512vl(auVar112);
    auVar114 = vmaxps_avx512vl(auVar111,auVar103);
    auVar104 = vmaxps_avx512vl(auVar104,auVar114);
    auVar114 = vaddps_avx512vl(auVar112,auVar104);
    auVar104 = vminps_avx512vl(auVar111,auVar103);
    auVar104 = vminps_avx(auVar96,auVar104);
    auVar104 = vsubps_avx512vl(auVar104,auVar112);
    auVar103._8_4_ = 0x3f800002;
    auVar103._0_8_ = 0x3f8000023f800002;
    auVar103._12_4_ = 0x3f800002;
    auVar103._16_4_ = 0x3f800002;
    auVar103._20_4_ = 0x3f800002;
    auVar103._24_4_ = 0x3f800002;
    auVar103._28_4_ = 0x3f800002;
    auVar96 = vmulps_avx512vl(auVar114,auVar103);
    auVar111._8_4_ = 0x3f7ffffc;
    auVar111._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar111._12_4_ = 0x3f7ffffc;
    auVar111._16_4_ = 0x3f7ffffc;
    auVar111._20_4_ = 0x3f7ffffc;
    auVar111._24_4_ = 0x3f7ffffc;
    auVar111._28_4_ = 0x3f7ffffc;
    auVar104 = vmulps_avx512vl(auVar104,auVar111);
    auVar118._4_4_ = auVar96._4_4_ * auVar96._4_4_;
    auVar118._0_4_ = auVar96._0_4_ * auVar96._0_4_;
    auVar118._8_4_ = auVar96._8_4_ * auVar96._8_4_;
    auVar118._12_4_ = auVar96._12_4_ * auVar96._12_4_;
    auVar118._16_4_ = auVar96._16_4_ * auVar96._16_4_;
    auVar118._20_4_ = auVar96._20_4_ * auVar96._20_4_;
    auVar118._24_4_ = auVar96._24_4_ * auVar96._24_4_;
    auVar118._28_4_ = auVar104._28_4_;
    auVar96 = vrsqrt14ps_avx512vl(auVar113);
    auVar112._8_4_ = 0xbf000000;
    auVar112._0_8_ = 0xbf000000bf000000;
    auVar112._12_4_ = 0xbf000000;
    auVar112._16_4_ = 0xbf000000;
    auVar112._20_4_ = 0xbf000000;
    auVar112._24_4_ = 0xbf000000;
    auVar112._28_4_ = 0xbf000000;
    auVar103 = vmulps_avx512vl(auVar113,auVar112);
    auVar119._4_4_ = auVar96._4_4_ * auVar103._4_4_;
    auVar119._0_4_ = auVar96._0_4_ * auVar103._0_4_;
    auVar119._8_4_ = auVar96._8_4_ * auVar103._8_4_;
    auVar119._12_4_ = auVar96._12_4_ * auVar103._12_4_;
    auVar119._16_4_ = auVar96._16_4_ * auVar103._16_4_;
    auVar119._20_4_ = auVar96._20_4_ * auVar103._20_4_;
    auVar119._24_4_ = auVar96._24_4_ * auVar103._24_4_;
    auVar119._28_4_ = auVar103._28_4_;
    auVar103 = vmulps_avx512vl(auVar96,auVar96);
    auVar103 = vmulps_avx512vl(auVar103,auVar119);
    auVar113._8_4_ = 0x3fc00000;
    auVar113._0_8_ = 0x3fc000003fc00000;
    auVar113._12_4_ = 0x3fc00000;
    auVar113._16_4_ = 0x3fc00000;
    auVar113._20_4_ = 0x3fc00000;
    auVar113._24_4_ = 0x3fc00000;
    auVar113._28_4_ = 0x3fc00000;
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar96,auVar113);
    auVar120._4_4_ = auVar103._4_4_ * auVar97._4_4_;
    auVar120._0_4_ = auVar103._0_4_ * auVar97._0_4_;
    auVar120._8_4_ = auVar103._8_4_ * auVar97._8_4_;
    auVar120._12_4_ = auVar103._12_4_ * auVar97._12_4_;
    auVar120._16_4_ = auVar103._16_4_ * auVar97._16_4_;
    auVar120._20_4_ = auVar103._20_4_ * auVar97._20_4_;
    auVar120._24_4_ = auVar103._24_4_ * auVar97._24_4_;
    auVar120._28_4_ = auVar96._28_4_;
    auVar96 = vmulps_avx512vl(auVar98,auVar103);
    auVar111 = vmulps_avx512vl(auVar99,auVar103);
    auVar112 = vsubps_avx512vl(auVar122,auVar100);
    auVar113 = vsubps_avx512vl(auVar122,auVar101);
    auVar116 = vsubps_avx512vl(auVar122,auVar102);
    auVar114 = vmulps_avx512vl(local_760,auVar116);
    auVar114 = vfmadd231ps_avx512vl(auVar114,local_740,auVar113);
    auVar114 = vfmadd231ps_avx512vl(auVar114,local_720,auVar112);
    auVar117 = vmulps_avx512vl(auVar116,auVar116);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar113,auVar113);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar112,auVar112);
    auVar119 = vmulps_avx512vl(local_760,auVar111);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar96,local_740);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar120,local_720);
    auVar111 = vmulps_avx512vl(auVar116,auVar111);
    auVar96 = vfmadd231ps_avx512vl(auVar111,auVar113,auVar96);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar112,auVar120);
    local_780 = vmulps_avx512vl(auVar119,auVar119);
    auVar111 = vsubps_avx512vl(local_520,local_780);
    auVar120 = vmulps_avx512vl(auVar119,auVar96);
    auVar114 = vsubps_avx512vl(auVar114,auVar120);
    auVar120 = vaddps_avx512vl(auVar114,auVar114);
    auVar114 = vmulps_avx512vl(auVar96,auVar96);
    auVar117 = vsubps_avx512vl(auVar117,auVar114);
    auVar118 = vsubps_avx512vl(auVar117,auVar118);
    local_940 = vmulps_avx512vl(auVar120,auVar120);
    auVar114._8_4_ = 0x40800000;
    auVar114._0_8_ = 0x4080000040800000;
    auVar114._12_4_ = 0x40800000;
    auVar114._16_4_ = 0x40800000;
    auVar114._20_4_ = 0x40800000;
    auVar114._24_4_ = 0x40800000;
    auVar114._28_4_ = 0x40800000;
    auVar114 = vmulps_avx512vl(auVar111,auVar114);
    auVar121 = vmulps_avx512vl(auVar114,auVar118);
    auVar121 = vsubps_avx512vl(local_940,auVar121);
    uVar70 = vcmpps_avx512vl(auVar121,auVar122,5);
    bVar54 = (byte)uVar70;
    if (bVar54 == 0) {
      auVar123 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar124 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar121 = vsqrtps_avx512vl(auVar121);
      auVar122 = vaddps_avx512vl(auVar111,auVar111);
      auVar123 = vrcp14ps_avx512vl(auVar122);
      auVar115 = vfnmadd213ps_avx512vl(auVar122,auVar123,auVar115);
      auVar115 = vfmadd132ps_avx512vl(auVar115,auVar123,auVar123);
      auVar29._8_4_ = 0x80000000;
      auVar29._0_8_ = 0x8000000080000000;
      auVar29._12_4_ = 0x80000000;
      auVar29._16_4_ = 0x80000000;
      auVar29._20_4_ = 0x80000000;
      auVar29._24_4_ = 0x80000000;
      auVar29._28_4_ = 0x80000000;
      auVar122 = vxorps_avx512vl(auVar120,auVar29);
      auVar122 = vsubps_avx512vl(auVar122,auVar121);
      auVar122 = vmulps_avx512vl(auVar122,auVar115);
      auVar121 = vsubps_avx512vl(auVar121,auVar120);
      auVar115 = vmulps_avx512vl(auVar121,auVar115);
      auVar121 = vfmadd213ps_avx512vl(auVar119,auVar122,auVar96);
      local_660 = vmulps_avx512vl(auVar103,auVar121);
      auVar121 = vfmadd213ps_avx512vl(auVar119,auVar115,auVar96);
      local_680 = vmulps_avx512vl(auVar103,auVar121);
      auVar121 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar121 = vblendmps_avx512vl(auVar121,auVar122);
      auVar123._0_4_ =
           (uint)(bVar54 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar54 & 1) * local_680._0_4_;
      bVar68 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar123._4_4_ = (uint)bVar68 * auVar121._4_4_ | (uint)!bVar68 * local_680._4_4_;
      bVar68 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar123._8_4_ = (uint)bVar68 * auVar121._8_4_ | (uint)!bVar68 * local_680._8_4_;
      bVar68 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar123._12_4_ = (uint)bVar68 * auVar121._12_4_ | (uint)!bVar68 * local_680._12_4_;
      bVar68 = (bool)((byte)(uVar70 >> 4) & 1);
      auVar123._16_4_ = (uint)bVar68 * auVar121._16_4_ | (uint)!bVar68 * local_680._16_4_;
      bVar68 = (bool)((byte)(uVar70 >> 5) & 1);
      auVar123._20_4_ = (uint)bVar68 * auVar121._20_4_ | (uint)!bVar68 * local_680._20_4_;
      bVar68 = (bool)((byte)(uVar70 >> 6) & 1);
      auVar123._24_4_ = (uint)bVar68 * auVar121._24_4_ | (uint)!bVar68 * local_680._24_4_;
      bVar68 = SUB81(uVar70 >> 7,0);
      auVar123._28_4_ = (uint)bVar68 * auVar121._28_4_ | (uint)!bVar68 * local_680._28_4_;
      auVar233._8_4_ = 0xff800000;
      auVar233._0_8_ = 0xff800000ff800000;
      auVar233._12_4_ = 0xff800000;
      auVar233._16_4_ = 0xff800000;
      auVar233._20_4_ = 0xff800000;
      auVar233._24_4_ = 0xff800000;
      auVar233._28_4_ = 0xff800000;
      auVar121 = vblendmps_avx512vl(auVar233,auVar115);
      auVar124._0_4_ =
           (uint)(bVar54 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar115._0_4_;
      bVar68 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar124._4_4_ = (uint)bVar68 * auVar121._4_4_ | (uint)!bVar68 * auVar115._4_4_;
      bVar68 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar124._8_4_ = (uint)bVar68 * auVar121._8_4_ | (uint)!bVar68 * auVar115._8_4_;
      bVar68 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar124._12_4_ = (uint)bVar68 * auVar121._12_4_ | (uint)!bVar68 * auVar115._12_4_;
      bVar68 = (bool)((byte)(uVar70 >> 4) & 1);
      auVar124._16_4_ = (uint)bVar68 * auVar121._16_4_ | (uint)!bVar68 * auVar115._16_4_;
      bVar68 = (bool)((byte)(uVar70 >> 5) & 1);
      auVar124._20_4_ = (uint)bVar68 * auVar121._20_4_ | (uint)!bVar68 * auVar115._20_4_;
      bVar68 = (bool)((byte)(uVar70 >> 6) & 1);
      auVar124._24_4_ = (uint)bVar68 * auVar121._24_4_ | (uint)!bVar68 * auVar115._24_4_;
      bVar68 = SUB81(uVar70 >> 7,0);
      auVar124._28_4_ = (uint)bVar68 * auVar121._28_4_ | (uint)!bVar68 * auVar115._28_4_;
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(local_780,auVar115);
      auVar121 = vmaxps_avx512vl(local_600,auVar115);
      auVar30._8_4_ = 0x36000000;
      auVar30._0_8_ = 0x3600000036000000;
      auVar30._12_4_ = 0x36000000;
      auVar30._16_4_ = 0x36000000;
      auVar30._20_4_ = 0x36000000;
      auVar30._24_4_ = 0x36000000;
      auVar30._28_4_ = 0x36000000;
      auVar121 = vmulps_avx512vl(auVar121,auVar30);
      vandps_avx512vl(auVar111,auVar115);
      uVar59 = vcmpps_avx512vl(auVar121,auVar121,1);
      uVar70 = uVar70 & uVar59;
      bVar61 = (byte)uVar70;
      if (bVar61 != 0) {
        uVar59 = vcmpps_avx512vl(auVar118,_DAT_02020f00,2);
        auVar244._8_4_ = 0xff800000;
        auVar244._0_8_ = 0xff800000ff800000;
        auVar244._12_4_ = 0xff800000;
        auVar244._16_4_ = 0xff800000;
        auVar244._20_4_ = 0xff800000;
        auVar244._24_4_ = 0xff800000;
        auVar244._28_4_ = 0xff800000;
        auVar115 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar118 = vblendmps_avx512vl(auVar115,auVar244);
        bVar56 = (byte)uVar59;
        uVar71 = (uint)(bVar56 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar56 & 1) * auVar121._0_4_;
        bVar68 = (bool)((byte)(uVar59 >> 1) & 1);
        uVar144 = (uint)bVar68 * auVar118._4_4_ | (uint)!bVar68 * auVar121._4_4_;
        bVar68 = (bool)((byte)(uVar59 >> 2) & 1);
        uVar145 = (uint)bVar68 * auVar118._8_4_ | (uint)!bVar68 * auVar121._8_4_;
        bVar68 = (bool)((byte)(uVar59 >> 3) & 1);
        uVar146 = (uint)bVar68 * auVar118._12_4_ | (uint)!bVar68 * auVar121._12_4_;
        bVar68 = (bool)((byte)(uVar59 >> 4) & 1);
        uVar147 = (uint)bVar68 * auVar118._16_4_ | (uint)!bVar68 * auVar121._16_4_;
        bVar68 = (bool)((byte)(uVar59 >> 5) & 1);
        uVar148 = (uint)bVar68 * auVar118._20_4_ | (uint)!bVar68 * auVar121._20_4_;
        bVar68 = (bool)((byte)(uVar59 >> 6) & 1);
        uVar149 = (uint)bVar68 * auVar118._24_4_ | (uint)!bVar68 * auVar121._24_4_;
        bVar68 = SUB81(uVar59 >> 7,0);
        uVar150 = (uint)bVar68 * auVar118._28_4_ | (uint)!bVar68 * auVar121._28_4_;
        auVar123._0_4_ = (bVar61 & 1) * uVar71 | !(bool)(bVar61 & 1) * auVar123._0_4_;
        bVar68 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar123._4_4_ = bVar68 * uVar144 | !bVar68 * auVar123._4_4_;
        bVar68 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar123._8_4_ = bVar68 * uVar145 | !bVar68 * auVar123._8_4_;
        bVar68 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar123._12_4_ = bVar68 * uVar146 | !bVar68 * auVar123._12_4_;
        bVar68 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar123._16_4_ = bVar68 * uVar147 | !bVar68 * auVar123._16_4_;
        bVar68 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar123._20_4_ = bVar68 * uVar148 | !bVar68 * auVar123._20_4_;
        bVar68 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar123._24_4_ = bVar68 * uVar149 | !bVar68 * auVar123._24_4_;
        bVar68 = SUB81(uVar70 >> 7,0);
        auVar123._28_4_ = bVar68 * uVar150 | !bVar68 * auVar123._28_4_;
        auVar115 = vblendmps_avx512vl(auVar244,auVar115);
        bVar68 = (bool)((byte)(uVar59 >> 1) & 1);
        bVar10 = (bool)((byte)(uVar59 >> 2) & 1);
        bVar11 = (bool)((byte)(uVar59 >> 3) & 1);
        bVar12 = (bool)((byte)(uVar59 >> 4) & 1);
        bVar13 = (bool)((byte)(uVar59 >> 5) & 1);
        bVar14 = (bool)((byte)(uVar59 >> 6) & 1);
        bVar15 = SUB81(uVar59 >> 7,0);
        auVar124._0_4_ =
             (uint)(bVar61 & 1) *
             ((uint)(bVar56 & 1) * auVar115._0_4_ | !(bool)(bVar56 & 1) * uVar71) |
             !(bool)(bVar61 & 1) * auVar124._0_4_;
        bVar9 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar124._4_4_ =
             (uint)bVar9 * ((uint)bVar68 * auVar115._4_4_ | !bVar68 * uVar144) |
             !bVar9 * auVar124._4_4_;
        bVar68 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar124._8_4_ =
             (uint)bVar68 * ((uint)bVar10 * auVar115._8_4_ | !bVar10 * uVar145) |
             !bVar68 * auVar124._8_4_;
        bVar68 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar124._12_4_ =
             (uint)bVar68 * ((uint)bVar11 * auVar115._12_4_ | !bVar11 * uVar146) |
             !bVar68 * auVar124._12_4_;
        bVar68 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar124._16_4_ =
             (uint)bVar68 * ((uint)bVar12 * auVar115._16_4_ | !bVar12 * uVar147) |
             !bVar68 * auVar124._16_4_;
        bVar68 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar124._20_4_ =
             (uint)bVar68 * ((uint)bVar13 * auVar115._20_4_ | !bVar13 * uVar148) |
             !bVar68 * auVar124._20_4_;
        bVar68 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar124._24_4_ =
             (uint)bVar68 * ((uint)bVar14 * auVar115._24_4_ | !bVar14 * uVar149) |
             !bVar68 * auVar124._24_4_;
        bVar68 = SUB81(uVar70 >> 7,0);
        auVar124._28_4_ =
             (uint)bVar68 * ((uint)bVar15 * auVar115._28_4_ | !bVar15 * uVar150) |
             !bVar68 * auVar124._28_4_;
        bVar54 = (~bVar61 | bVar56) & bVar54;
      }
      auVar236 = ZEXT3264(_DAT_02020f20);
    }
    if ((bVar54 & 0x7f) == 0) {
      auVar128._8_4_ = 0x3f800000;
      auVar128._0_8_ = &DAT_3f8000003f800000;
      auVar128._12_4_ = 0x3f800000;
      auVar128._16_4_ = 0x3f800000;
      auVar128._20_4_ = 0x3f800000;
      auVar128._24_4_ = 0x3f800000;
      auVar128._28_4_ = 0x3f800000;
LAB_01c42070:
      auVar269 = ZEXT3264(auVar106);
      auVar221 = ZEXT3264(auVar128);
      auVar275 = ZEXT3264(_local_960);
      auVar288 = ZEXT3264(local_980);
      auVar139._32_32_ = auVar135;
      auVar143 = auVar139;
    }
    else {
      fVar268 = *(float *)(ray + k * 4 + 0x200) - (float)local_830._0_4_;
      auVar234._4_4_ = fVar268;
      auVar234._0_4_ = fVar268;
      auVar234._8_4_ = fVar268;
      auVar234._12_4_ = fVar268;
      auVar234._16_4_ = fVar268;
      auVar234._20_4_ = fVar268;
      auVar234._24_4_ = fVar268;
      auVar234._28_4_ = fVar268;
      auVar115 = vminps_avx512vl(auVar234,auVar124);
      auVar53._4_4_ = fStack_53c;
      auVar53._0_4_ = local_540;
      auVar53._8_4_ = fStack_538;
      auVar53._12_4_ = fStack_534;
      auVar53._16_4_ = fStack_530;
      auVar53._20_4_ = fStack_52c;
      auVar53._24_4_ = fStack_528;
      auVar53._28_4_ = fStack_524;
      auVar118 = vmaxps_avx512vl(auVar53,auVar123);
      auVar116 = vmulps_avx512vl(auVar127,auVar116);
      auVar113 = vfmadd213ps_avx512vl(auVar113,auVar126,auVar116);
      auVar112 = vfmadd213ps_avx512vl(auVar112,auVar125,auVar113);
      auVar113 = vmulps_avx512vl(local_760,auVar127);
      auVar113 = vfmadd231ps_avx512vl(auVar113,local_740,auVar126);
      auVar113 = vfmadd231ps_avx512vl(auVar113,local_720,auVar125);
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar113,auVar116);
      auVar125 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar17 = vcmpps_avx512vl(auVar116,auVar125,1);
      auVar126 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar112 = vxorps_avx512vl(auVar112,auVar126);
      auVar127 = vrcp14ps_avx512vl(auVar113);
      auVar121 = vxorps_avx512vl(auVar113,auVar126);
      auVar128 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar122 = vfnmadd213ps_avx512vl(auVar127,auVar113,auVar128);
      auVar122 = vfmadd132ps_avx512vl(auVar122,auVar127,auVar127);
      auVar122 = vmulps_avx512vl(auVar122,auVar112);
      uVar18 = vcmpps_avx512vl(auVar113,auVar121,1);
      bVar61 = (byte)uVar17 | (byte)uVar18;
      auVar123 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar112 = vblendmps_avx512vl(auVar122,auVar123);
      auVar129._0_4_ =
           (uint)(bVar61 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar127._0_4_;
      bVar68 = (bool)(bVar61 >> 1 & 1);
      auVar129._4_4_ = (uint)bVar68 * auVar112._4_4_ | (uint)!bVar68 * auVar127._4_4_;
      bVar68 = (bool)(bVar61 >> 2 & 1);
      auVar129._8_4_ = (uint)bVar68 * auVar112._8_4_ | (uint)!bVar68 * auVar127._8_4_;
      bVar68 = (bool)(bVar61 >> 3 & 1);
      auVar129._12_4_ = (uint)bVar68 * auVar112._12_4_ | (uint)!bVar68 * auVar127._12_4_;
      bVar68 = (bool)(bVar61 >> 4 & 1);
      auVar129._16_4_ = (uint)bVar68 * auVar112._16_4_ | (uint)!bVar68 * auVar127._16_4_;
      bVar68 = (bool)(bVar61 >> 5 & 1);
      auVar129._20_4_ = (uint)bVar68 * auVar112._20_4_ | (uint)!bVar68 * auVar127._20_4_;
      bVar68 = (bool)(bVar61 >> 6 & 1);
      auVar129._24_4_ = (uint)bVar68 * auVar112._24_4_ | (uint)!bVar68 * auVar127._24_4_;
      auVar129._28_4_ =
           (uint)(bVar61 >> 7) * auVar112._28_4_ | (uint)!(bool)(bVar61 >> 7) * auVar127._28_4_;
      auVar112 = vmaxps_avx(auVar118,auVar129);
      uVar18 = vcmpps_avx512vl(auVar113,auVar121,6);
      bVar61 = (byte)uVar17 | (byte)uVar18;
      auVar127 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar130._0_4_ =
           (uint)(bVar61 & 1) * auVar127._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar122._0_4_;
      bVar68 = (bool)(bVar61 >> 1 & 1);
      auVar130._4_4_ = (uint)bVar68 * auVar127._4_4_ | (uint)!bVar68 * auVar122._4_4_;
      bVar68 = (bool)(bVar61 >> 2 & 1);
      auVar130._8_4_ = (uint)bVar68 * auVar127._8_4_ | (uint)!bVar68 * auVar122._8_4_;
      bVar68 = (bool)(bVar61 >> 3 & 1);
      auVar130._12_4_ = (uint)bVar68 * auVar127._12_4_ | (uint)!bVar68 * auVar122._12_4_;
      bVar68 = (bool)(bVar61 >> 4 & 1);
      auVar130._16_4_ = (uint)bVar68 * auVar127._16_4_ | (uint)!bVar68 * auVar122._16_4_;
      bVar68 = (bool)(bVar61 >> 5 & 1);
      auVar130._20_4_ = (uint)bVar68 * auVar127._20_4_ | (uint)!bVar68 * auVar122._20_4_;
      bVar68 = (bool)(bVar61 >> 6 & 1);
      auVar130._24_4_ = (uint)bVar68 * auVar127._24_4_ | (uint)!bVar68 * auVar122._24_4_;
      auVar130._28_4_ =
           (uint)(bVar61 >> 7) * auVar127._28_4_ | (uint)!(bool)(bVar61 >> 7) * auVar122._28_4_;
      auVar113 = vminps_avx(auVar115,auVar130);
      auVar283 = ZEXT864(0) << 0x20;
      auVar105 = vsubps_avx(ZEXT832(0) << 0x20,auVar105);
      auVar115 = vsubps_avx(ZEXT832(0) << 0x20,auVar106);
      auVar118 = ZEXT832(0) << 0x20;
      auVar107 = vsubps_avx(auVar118,auVar107);
      auVar107 = vmulps_avx512vl(auVar107,auVar110);
      auVar107 = vfnmsub231ps_avx512vl(auVar107,auVar109,auVar115);
      auVar105 = vfnmadd231ps_avx512vl(auVar107,auVar108,auVar105);
      auVar107 = vmulps_avx512vl(local_760,auVar110);
      auVar107 = vfnmsub231ps_avx512vl(auVar107,local_740,auVar109);
      auVar107 = vfnmadd231ps_avx512vl(auVar107,local_720,auVar108);
      vandps_avx512vl(auVar107,auVar116);
      uVar17 = vcmpps_avx512vl(auVar107,auVar125,1);
      auVar105 = vxorps_avx512vl(auVar105,auVar126);
      auVar108 = vrcp14ps_avx512vl(auVar107);
      auVar109 = vxorps_avx512vl(auVar107,auVar126);
      auVar110 = vfnmadd213ps_avx512vl(auVar108,auVar107,auVar128);
      auVar78 = vfmadd132ps_fma(auVar110,auVar108,auVar108);
      auVar279 = ZEXT1664(auVar78);
      fVar268 = auVar78._0_4_ * auVar105._0_4_;
      fVar270 = auVar78._4_4_ * auVar105._4_4_;
      auVar39._4_4_ = fVar270;
      auVar39._0_4_ = fVar268;
      fVar271 = auVar78._8_4_ * auVar105._8_4_;
      auVar39._8_4_ = fVar271;
      fVar272 = auVar78._12_4_ * auVar105._12_4_;
      auVar39._12_4_ = fVar272;
      fVar258 = auVar105._16_4_ * 0.0;
      auVar39._16_4_ = fVar258;
      fVar259 = auVar105._20_4_ * 0.0;
      auVar39._20_4_ = fVar259;
      fVar273 = auVar105._24_4_ * 0.0;
      auVar39._24_4_ = fVar273;
      auVar39._28_4_ = auVar105._28_4_;
      uVar18 = vcmpps_avx512vl(auVar107,auVar109,1);
      bVar61 = (byte)uVar17 | (byte)uVar18;
      auVar110 = vblendmps_avx512vl(auVar39,auVar123);
      auVar131._0_4_ =
           (uint)(bVar61 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar108._0_4_;
      bVar68 = (bool)(bVar61 >> 1 & 1);
      auVar131._4_4_ = (uint)bVar68 * auVar110._4_4_ | (uint)!bVar68 * auVar108._4_4_;
      bVar68 = (bool)(bVar61 >> 2 & 1);
      auVar131._8_4_ = (uint)bVar68 * auVar110._8_4_ | (uint)!bVar68 * auVar108._8_4_;
      bVar68 = (bool)(bVar61 >> 3 & 1);
      auVar131._12_4_ = (uint)bVar68 * auVar110._12_4_ | (uint)!bVar68 * auVar108._12_4_;
      bVar68 = (bool)(bVar61 >> 4 & 1);
      auVar131._16_4_ = (uint)bVar68 * auVar110._16_4_ | (uint)!bVar68 * auVar108._16_4_;
      bVar68 = (bool)(bVar61 >> 5 & 1);
      auVar131._20_4_ = (uint)bVar68 * auVar110._20_4_ | (uint)!bVar68 * auVar108._20_4_;
      bVar68 = (bool)(bVar61 >> 6 & 1);
      auVar131._24_4_ = (uint)bVar68 * auVar110._24_4_ | (uint)!bVar68 * auVar108._24_4_;
      auVar131._28_4_ =
           (uint)(bVar61 >> 7) * auVar110._28_4_ | (uint)!(bool)(bVar61 >> 7) * auVar108._28_4_;
      _local_7a0 = vmaxps_avx(auVar112,auVar131);
      uVar18 = vcmpps_avx512vl(auVar107,auVar109,6);
      bVar61 = (byte)uVar17 | (byte)uVar18;
      auVar106._0_4_ =
           (uint)(bVar61 & 1) * auVar127._0_4_ | (uint)!(bool)(bVar61 & 1) * (int)fVar268;
      bVar68 = (bool)(bVar61 >> 1 & 1);
      auVar106._4_4_ = (uint)bVar68 * auVar127._4_4_ | (uint)!bVar68 * (int)fVar270;
      bVar68 = (bool)(bVar61 >> 2 & 1);
      auVar106._8_4_ = (uint)bVar68 * auVar127._8_4_ | (uint)!bVar68 * (int)fVar271;
      bVar68 = (bool)(bVar61 >> 3 & 1);
      auVar106._12_4_ = (uint)bVar68 * auVar127._12_4_ | (uint)!bVar68 * (int)fVar272;
      bVar68 = (bool)(bVar61 >> 4 & 1);
      auVar106._16_4_ = (uint)bVar68 * auVar127._16_4_ | (uint)!bVar68 * (int)fVar258;
      bVar68 = (bool)(bVar61 >> 5 & 1);
      auVar106._20_4_ = (uint)bVar68 * auVar127._20_4_ | (uint)!bVar68 * (int)fVar259;
      bVar68 = (bool)(bVar61 >> 6 & 1);
      auVar106._24_4_ = (uint)bVar68 * auVar127._24_4_ | (uint)!bVar68 * (int)fVar273;
      auVar106._28_4_ =
           (uint)(bVar61 >> 7) * auVar127._28_4_ | (uint)!(bool)(bVar61 >> 7) * auVar105._28_4_;
      local_5c0 = vminps_avx(auVar113,auVar106);
      auVar267 = ZEXT3264(local_5c0);
      uVar17 = vcmpps_avx512vl(_local_7a0,local_5c0,2);
      bVar54 = bVar54 & 0x7f & (byte)uVar17;
      if (bVar54 == 0) {
        auVar236 = ZEXT3264(_DAT_02020f20);
        goto LAB_01c42070;
      }
      auVar104 = vmaxps_avx(auVar118,auVar104);
      auVar112 = vminps_avx512vl(local_660,auVar128);
      auVar47 = ZEXT412(0);
      auVar113 = ZEXT1232(auVar47) << 0x20;
      auVar112 = vmaxps_avx(auVar112,ZEXT1232(auVar47) << 0x20);
      auVar105 = vminps_avx512vl(local_680,auVar128);
      auVar40._4_4_ = (auVar112._4_4_ + 1.0) * 0.125;
      auVar40._0_4_ = (auVar112._0_4_ + 0.0) * 0.125;
      auVar40._8_4_ = (auVar112._8_4_ + 2.0) * 0.125;
      auVar40._12_4_ = (auVar112._12_4_ + 3.0) * 0.125;
      auVar40._16_4_ = (auVar112._16_4_ + 4.0) * 0.125;
      auVar40._20_4_ = (auVar112._20_4_ + 5.0) * 0.125;
      auVar40._24_4_ = (auVar112._24_4_ + 6.0) * 0.125;
      auVar40._28_4_ = auVar112._28_4_ + 7.0;
      local_660 = vfmadd213ps_avx512vl(auVar40,local_920,auVar242);
      auVar112 = vmaxps_avx(auVar105,ZEXT1232(auVar47) << 0x20);
      auVar41._4_4_ = (auVar112._4_4_ + 1.0) * 0.125;
      auVar41._0_4_ = (auVar112._0_4_ + 0.0) * 0.125;
      auVar41._8_4_ = (auVar112._8_4_ + 2.0) * 0.125;
      auVar41._12_4_ = (auVar112._12_4_ + 3.0) * 0.125;
      auVar41._16_4_ = (auVar112._16_4_ + 4.0) * 0.125;
      auVar41._20_4_ = (auVar112._20_4_ + 5.0) * 0.125;
      auVar41._24_4_ = (auVar112._24_4_ + 6.0) * 0.125;
      auVar41._28_4_ = auVar112._28_4_ + 7.0;
      local_680 = vfmadd213ps_avx512vl(auVar41,local_920,auVar242);
      auVar42._4_4_ = auVar104._4_4_ * auVar104._4_4_;
      auVar42._0_4_ = auVar104._0_4_ * auVar104._0_4_;
      auVar42._8_4_ = auVar104._8_4_ * auVar104._8_4_;
      auVar42._12_4_ = auVar104._12_4_ * auVar104._12_4_;
      auVar42._16_4_ = auVar104._16_4_ * auVar104._16_4_;
      auVar42._20_4_ = auVar104._20_4_ * auVar104._20_4_;
      auVar42._24_4_ = auVar104._24_4_ * auVar104._24_4_;
      auVar42._28_4_ = local_680._28_4_;
      auVar104 = vsubps_avx(auVar117,auVar42);
      local_c00 = auVar114._0_4_;
      fStack_bfc = auVar114._4_4_;
      fStack_bf8 = auVar114._8_4_;
      fStack_bf4 = auVar114._12_4_;
      fStack_bf0 = auVar114._16_4_;
      fStack_bec = auVar114._20_4_;
      fStack_be8 = auVar114._24_4_;
      auVar43._4_4_ = auVar104._4_4_ * fStack_bfc;
      auVar43._0_4_ = auVar104._0_4_ * local_c00;
      auVar43._8_4_ = auVar104._8_4_ * fStack_bf8;
      auVar43._12_4_ = auVar104._12_4_ * fStack_bf4;
      auVar43._16_4_ = auVar104._16_4_ * fStack_bf0;
      auVar43._20_4_ = auVar104._20_4_ * fStack_bec;
      auVar43._24_4_ = auVar104._24_4_ * fStack_be8;
      auVar43._28_4_ = local_680._28_4_;
      auVar112 = vsubps_avx(local_940,auVar43);
      uVar17 = vcmpps_avx512vl(auVar112,ZEXT1232(auVar47) << 0x20,5);
      bVar61 = (byte)uVar17;
      if (bVar61 == 0) {
        auVar96 = ZEXT832(0) << 0x20;
        auVar174 = ZEXT864(0) << 0x20;
        auVar112 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar114 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar269 = ZEXT864(0) << 0x20;
        auVar132._8_4_ = 0x7f800000;
        auVar132._0_8_ = 0x7f8000007f800000;
        auVar132._12_4_ = 0x7f800000;
        auVar132._16_4_ = 0x7f800000;
        auVar132._20_4_ = 0x7f800000;
        auVar132._24_4_ = 0x7f800000;
        auVar132._28_4_ = 0x7f800000;
        auVar133._8_4_ = 0xff800000;
        auVar133._0_8_ = 0xff800000ff800000;
        auVar133._12_4_ = 0xff800000;
        auVar133._16_4_ = 0xff800000;
        auVar133._20_4_ = 0xff800000;
        auVar133._24_4_ = 0xff800000;
        auVar133._28_4_ = 0xff800000;
      }
      else {
        auVar79 = vxorps_avx512vl(local_780._0_16_,local_780._0_16_);
        uVar70 = vcmpps_avx512vl(auVar112,auVar118,5);
        auVar112 = vsqrtps_avx(auVar112);
        auVar243._0_4_ = auVar111._0_4_ + auVar111._0_4_;
        auVar243._4_4_ = auVar111._4_4_ + auVar111._4_4_;
        auVar243._8_4_ = auVar111._8_4_ + auVar111._8_4_;
        auVar243._12_4_ = auVar111._12_4_ + auVar111._12_4_;
        auVar243._16_4_ = auVar111._16_4_ + auVar111._16_4_;
        auVar243._20_4_ = auVar111._20_4_ + auVar111._20_4_;
        auVar243._24_4_ = auVar111._24_4_ + auVar111._24_4_;
        auVar243._28_4_ = auVar111._28_4_ + auVar111._28_4_;
        auVar113 = vrcp14ps_avx512vl(auVar243);
        auVar114 = vfnmadd213ps_avx512vl(auVar243,auVar113,auVar128);
        auVar78 = vfmadd132ps_fma(auVar114,auVar113,auVar113);
        auVar31._8_4_ = 0x80000000;
        auVar31._0_8_ = 0x8000000080000000;
        auVar31._12_4_ = 0x80000000;
        auVar31._16_4_ = 0x80000000;
        auVar31._20_4_ = 0x80000000;
        auVar31._24_4_ = 0x80000000;
        auVar31._28_4_ = 0x80000000;
        auVar113 = vxorps_avx512vl(auVar120,auVar31);
        auVar113 = vsubps_avx(auVar113,auVar112);
        auVar44._4_4_ = auVar113._4_4_ * auVar78._4_4_;
        auVar44._0_4_ = auVar113._0_4_ * auVar78._0_4_;
        auVar44._8_4_ = auVar113._8_4_ * auVar78._8_4_;
        auVar44._12_4_ = auVar113._12_4_ * auVar78._12_4_;
        auVar44._16_4_ = auVar113._16_4_ * 0.0;
        auVar44._20_4_ = auVar113._20_4_ * 0.0;
        auVar44._24_4_ = auVar113._24_4_ * 0.0;
        auVar44._28_4_ = 0x3e000000;
        auVar112 = vsubps_avx512vl(auVar112,auVar120);
        auVar282._0_4_ = auVar112._0_4_ * auVar78._0_4_;
        auVar282._4_4_ = auVar112._4_4_ * auVar78._4_4_;
        auVar282._8_4_ = auVar112._8_4_ * auVar78._8_4_;
        auVar282._12_4_ = auVar112._12_4_ * auVar78._12_4_;
        auVar282._16_4_ = auVar112._16_4_ * 0.0;
        auVar282._20_4_ = auVar112._20_4_ * 0.0;
        auVar282._24_4_ = auVar112._24_4_ * 0.0;
        auVar282._28_4_ = 0;
        auVar112 = vfmadd213ps_avx512vl(auVar119,auVar44,auVar96);
        auVar45._4_4_ = auVar103._4_4_ * auVar112._4_4_;
        auVar45._0_4_ = auVar103._0_4_ * auVar112._0_4_;
        auVar45._8_4_ = auVar103._8_4_ * auVar112._8_4_;
        auVar45._12_4_ = auVar103._12_4_ * auVar112._12_4_;
        auVar45._16_4_ = auVar103._16_4_ * auVar112._16_4_;
        auVar45._20_4_ = auVar103._20_4_ * auVar112._20_4_;
        auVar45._24_4_ = auVar103._24_4_ * auVar112._24_4_;
        auVar45._28_4_ = auVar113._28_4_;
        auVar112 = vmulps_avx512vl(local_720,auVar44);
        auVar113 = vmulps_avx512vl(local_740,auVar44);
        auVar105 = vmulps_avx512vl(local_760,auVar44);
        auVar114 = vfmadd213ps_avx512vl(auVar97,auVar45,auVar100);
        auVar112 = vsubps_avx512vl(auVar112,auVar114);
        auVar114 = vfmadd213ps_avx512vl(auVar98,auVar45,auVar101);
        auVar114 = vsubps_avx512vl(auVar113,auVar114);
        auVar78 = vfmadd213ps_fma(auVar45,auVar99,auVar102);
        auVar113 = vsubps_avx(auVar105,ZEXT1632(auVar78));
        auVar269 = ZEXT3264(auVar113);
        auVar96 = vfmadd213ps_avx512vl(auVar119,auVar282,auVar96);
        auVar103 = vmulps_avx512vl(auVar103,auVar96);
        auVar96 = vmulps_avx512vl(local_720,auVar282);
        auVar105 = vmulps_avx512vl(local_740,auVar282);
        auVar107 = vmulps_avx512vl(local_760,auVar282);
        auVar78 = vfmadd213ps_fma(auVar97,auVar103,auVar100);
        auVar113 = vsubps_avx(auVar96,ZEXT1632(auVar78));
        auVar78 = vfmadd213ps_fma(auVar98,auVar103,auVar101);
        auVar96 = vsubps_avx512vl(auVar105,ZEXT1632(auVar78));
        auVar78 = vfmadd213ps_fma(auVar99,auVar103,auVar102);
        auVar97 = vsubps_avx512vl(auVar107,ZEXT1632(auVar78));
        auVar174 = ZEXT3264(auVar97);
        auVar165._8_4_ = 0x7f800000;
        auVar165._0_8_ = 0x7f8000007f800000;
        auVar165._12_4_ = 0x7f800000;
        auVar165._16_4_ = 0x7f800000;
        auVar165._20_4_ = 0x7f800000;
        auVar165._24_4_ = 0x7f800000;
        auVar165._28_4_ = 0x7f800000;
        auVar97 = vblendmps_avx512vl(auVar165,auVar44);
        bVar68 = (bool)((byte)uVar70 & 1);
        auVar132._0_4_ = (uint)bVar68 * auVar97._0_4_ | (uint)!bVar68 * auVar100._0_4_;
        bVar68 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar132._4_4_ = (uint)bVar68 * auVar97._4_4_ | (uint)!bVar68 * auVar100._4_4_;
        bVar68 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar132._8_4_ = (uint)bVar68 * auVar97._8_4_ | (uint)!bVar68 * auVar100._8_4_;
        bVar68 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar132._12_4_ = (uint)bVar68 * auVar97._12_4_ | (uint)!bVar68 * auVar100._12_4_;
        bVar68 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar132._16_4_ = (uint)bVar68 * auVar97._16_4_ | (uint)!bVar68 * auVar100._16_4_;
        bVar68 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar132._20_4_ = (uint)bVar68 * auVar97._20_4_ | (uint)!bVar68 * auVar100._20_4_;
        bVar68 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar132._24_4_ = (uint)bVar68 * auVar97._24_4_ | (uint)!bVar68 * auVar100._24_4_;
        bVar68 = SUB81(uVar70 >> 7,0);
        auVar132._28_4_ = (uint)bVar68 * auVar97._28_4_ | (uint)!bVar68 * auVar100._28_4_;
        auVar166._8_4_ = 0xff800000;
        auVar166._0_8_ = 0xff800000ff800000;
        auVar166._12_4_ = 0xff800000;
        auVar166._16_4_ = 0xff800000;
        auVar166._20_4_ = 0xff800000;
        auVar166._24_4_ = 0xff800000;
        auVar166._28_4_ = 0xff800000;
        auVar97 = vblendmps_avx512vl(auVar166,auVar282);
        bVar68 = (bool)((byte)uVar70 & 1);
        auVar133._0_4_ = (uint)bVar68 * auVar97._0_4_ | (uint)!bVar68 * -0x800000;
        bVar68 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar133._4_4_ = (uint)bVar68 * auVar97._4_4_ | (uint)!bVar68 * -0x800000;
        bVar68 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar133._8_4_ = (uint)bVar68 * auVar97._8_4_ | (uint)!bVar68 * -0x800000;
        bVar68 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar133._12_4_ = (uint)bVar68 * auVar97._12_4_ | (uint)!bVar68 * -0x800000;
        bVar68 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar133._16_4_ = (uint)bVar68 * auVar97._16_4_ | (uint)!bVar68 * -0x800000;
        bVar68 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar133._20_4_ = (uint)bVar68 * auVar97._20_4_ | (uint)!bVar68 * -0x800000;
        bVar68 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar133._24_4_ = (uint)bVar68 * auVar97._24_4_ | (uint)!bVar68 * -0x800000;
        bVar68 = SUB81(uVar70 >> 7,0);
        auVar133._28_4_ = (uint)bVar68 * auVar97._28_4_ | (uint)!bVar68 * -0x800000;
        auVar263._8_4_ = 0x7fffffff;
        auVar263._0_8_ = 0x7fffffff7fffffff;
        auVar263._12_4_ = 0x7fffffff;
        auVar263._16_4_ = 0x7fffffff;
        auVar263._20_4_ = 0x7fffffff;
        auVar263._24_4_ = 0x7fffffff;
        auVar263._28_4_ = 0x7fffffff;
        auVar97 = vandps_avx(auVar263,local_780);
        auVar97 = vmaxps_avx(local_600,auVar97);
        auVar32._8_4_ = 0x36000000;
        auVar32._0_8_ = 0x3600000036000000;
        auVar32._12_4_ = 0x36000000;
        auVar32._16_4_ = 0x36000000;
        auVar32._20_4_ = 0x36000000;
        auVar32._24_4_ = 0x36000000;
        auVar32._28_4_ = 0x36000000;
        auVar98 = vmulps_avx512vl(auVar97,auVar32);
        auVar97 = vandps_avx(auVar111,auVar263);
        uVar59 = vcmpps_avx512vl(auVar97,auVar98,1);
        uVar70 = uVar70 & uVar59;
        bVar56 = (byte)uVar70;
        if (bVar56 != 0) {
          uVar59 = vcmpps_avx512vl(auVar104,ZEXT1632(auVar79),2);
          auVar264._8_4_ = 0xff800000;
          auVar264._0_8_ = 0xff800000ff800000;
          auVar264._12_4_ = 0xff800000;
          auVar264._16_4_ = 0xff800000;
          auVar264._20_4_ = 0xff800000;
          auVar264._24_4_ = 0xff800000;
          auVar264._28_4_ = 0xff800000;
          auVar277._8_4_ = 0x7f800000;
          auVar277._0_8_ = 0x7f8000007f800000;
          auVar277._12_4_ = 0x7f800000;
          auVar277._16_4_ = 0x7f800000;
          auVar277._20_4_ = 0x7f800000;
          auVar277._24_4_ = 0x7f800000;
          auVar277._28_4_ = 0x7f800000;
          auVar104 = vblendmps_avx512vl(auVar277,auVar264);
          bVar60 = (byte)uVar59;
          uVar71 = (uint)(bVar60 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar98._0_4_;
          bVar68 = (bool)((byte)(uVar59 >> 1) & 1);
          uVar144 = (uint)bVar68 * auVar104._4_4_ | (uint)!bVar68 * auVar98._4_4_;
          bVar68 = (bool)((byte)(uVar59 >> 2) & 1);
          uVar145 = (uint)bVar68 * auVar104._8_4_ | (uint)!bVar68 * auVar98._8_4_;
          bVar68 = (bool)((byte)(uVar59 >> 3) & 1);
          uVar146 = (uint)bVar68 * auVar104._12_4_ | (uint)!bVar68 * auVar98._12_4_;
          bVar68 = (bool)((byte)(uVar59 >> 4) & 1);
          uVar147 = (uint)bVar68 * auVar104._16_4_ | (uint)!bVar68 * auVar98._16_4_;
          bVar68 = (bool)((byte)(uVar59 >> 5) & 1);
          uVar148 = (uint)bVar68 * auVar104._20_4_ | (uint)!bVar68 * auVar98._20_4_;
          bVar68 = (bool)((byte)(uVar59 >> 6) & 1);
          uVar149 = (uint)bVar68 * auVar104._24_4_ | (uint)!bVar68 * auVar98._24_4_;
          bVar68 = SUB81(uVar59 >> 7,0);
          uVar150 = (uint)bVar68 * auVar104._28_4_ | (uint)!bVar68 * auVar98._28_4_;
          auVar132._0_4_ = (bVar56 & 1) * uVar71 | !(bool)(bVar56 & 1) * auVar132._0_4_;
          bVar68 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar132._4_4_ = bVar68 * uVar144 | !bVar68 * auVar132._4_4_;
          bVar68 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar132._8_4_ = bVar68 * uVar145 | !bVar68 * auVar132._8_4_;
          bVar68 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar132._12_4_ = bVar68 * uVar146 | !bVar68 * auVar132._12_4_;
          bVar68 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar132._16_4_ = bVar68 * uVar147 | !bVar68 * auVar132._16_4_;
          bVar68 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar132._20_4_ = bVar68 * uVar148 | !bVar68 * auVar132._20_4_;
          bVar68 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar132._24_4_ = bVar68 * uVar149 | !bVar68 * auVar132._24_4_;
          bVar68 = SUB81(uVar70 >> 7,0);
          auVar132._28_4_ = bVar68 * uVar150 | !bVar68 * auVar132._28_4_;
          auVar104 = vblendmps_avx512vl(auVar264,auVar277);
          bVar68 = (bool)((byte)(uVar59 >> 1) & 1);
          bVar10 = (bool)((byte)(uVar59 >> 2) & 1);
          bVar11 = (bool)((byte)(uVar59 >> 3) & 1);
          bVar12 = (bool)((byte)(uVar59 >> 4) & 1);
          bVar13 = (bool)((byte)(uVar59 >> 5) & 1);
          bVar14 = (bool)((byte)(uVar59 >> 6) & 1);
          bVar15 = SUB81(uVar59 >> 7,0);
          auVar133._0_4_ =
               (uint)(bVar56 & 1) *
               ((uint)(bVar60 & 1) * auVar104._0_4_ | !(bool)(bVar60 & 1) * uVar71) |
               !(bool)(bVar56 & 1) * auVar133._0_4_;
          bVar9 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar133._4_4_ =
               (uint)bVar9 * ((uint)bVar68 * auVar104._4_4_ | !bVar68 * uVar144) |
               !bVar9 * auVar133._4_4_;
          bVar68 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar133._8_4_ =
               (uint)bVar68 * ((uint)bVar10 * auVar104._8_4_ | !bVar10 * uVar145) |
               !bVar68 * auVar133._8_4_;
          bVar68 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar133._12_4_ =
               (uint)bVar68 * ((uint)bVar11 * auVar104._12_4_ | !bVar11 * uVar146) |
               !bVar68 * auVar133._12_4_;
          bVar68 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar133._16_4_ =
               (uint)bVar68 * ((uint)bVar12 * auVar104._16_4_ | !bVar12 * uVar147) |
               !bVar68 * auVar133._16_4_;
          bVar68 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar133._20_4_ =
               (uint)bVar68 * ((uint)bVar13 * auVar104._20_4_ | !bVar13 * uVar148) |
               !bVar68 * auVar133._20_4_;
          bVar68 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar133._24_4_ =
               (uint)bVar68 * ((uint)bVar14 * auVar104._24_4_ | !bVar14 * uVar149) |
               !bVar68 * auVar133._24_4_;
          bVar68 = SUB81(uVar70 >> 7,0);
          auVar133._28_4_ =
               (uint)bVar68 * ((uint)bVar15 * auVar104._28_4_ | !bVar15 * uVar150) |
               !bVar68 * auVar133._28_4_;
          bVar61 = (~bVar56 | bVar60) & bVar61;
        }
      }
      auVar276._8_4_ = 0x7fffffff;
      auVar276._0_8_ = 0x7fffffff7fffffff;
      auVar276._12_4_ = 0x7fffffff;
      auVar288 = ZEXT3264(local_980);
      auVar283 = ZEXT3264(local_760);
      auVar236._0_4_ = local_760._0_4_ * auVar174._0_4_;
      auVar236._4_4_ = local_760._4_4_ * auVar174._4_4_;
      auVar236._8_4_ = local_760._8_4_ * auVar174._8_4_;
      auVar236._12_4_ = local_760._12_4_ * auVar174._12_4_;
      auVar236._16_4_ = local_760._16_4_ * auVar174._16_4_;
      auVar236._20_4_ = local_760._20_4_ * auVar174._20_4_;
      auVar236._28_36_ = auVar174._28_36_;
      auVar236._24_4_ = local_760._24_4_ * auVar174._24_4_;
      auVar279 = ZEXT3264(local_740);
      auVar78 = vfmadd231ps_fma(auVar236._0_32_,local_740,auVar96);
      auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),local_720,auVar113);
      _local_500 = _local_7a0;
      local_4e0 = vminps_avx(local_5c0,auVar132);
      auVar257._8_4_ = 0x7fffffff;
      auVar257._0_8_ = 0x7fffffff7fffffff;
      auVar257._12_4_ = 0x7fffffff;
      auVar257._16_4_ = 0x7fffffff;
      auVar257._20_4_ = 0x7fffffff;
      auVar257._24_4_ = 0x7fffffff;
      auVar257._28_4_ = 0x7fffffff;
      auVar104 = vandps_avx(ZEXT1632(auVar78),auVar257);
      _local_6c0 = vmaxps_avx(_local_7a0,auVar133);
      auVar250 = ZEXT3264(_local_6c0);
      _local_5e0 = _local_6c0;
      auVar167._8_4_ = 0x3e99999a;
      auVar167._0_8_ = 0x3e99999a3e99999a;
      auVar167._12_4_ = 0x3e99999a;
      auVar167._16_4_ = 0x3e99999a;
      auVar167._20_4_ = 0x3e99999a;
      auVar167._24_4_ = 0x3e99999a;
      auVar167._28_4_ = 0x3e99999a;
      uVar17 = vcmpps_avx512vl(auVar104,auVar167,1);
      uVar18 = vcmpps_avx512vl(_local_7a0,local_4e0,2);
      bVar56 = (byte)uVar18 & bVar54;
      uVar19 = vcmpps_avx512vl(_local_6c0,local_5c0,2);
      auVar140._32_32_ = auVar135;
      if ((bVar54 & ((byte)uVar19 | (byte)uVar18)) == 0) {
        auVar236 = ZEXT3264(_DAT_02020f20);
        auVar221 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
        auVar275 = ZEXT3264(_local_960);
        auVar143 = auVar140;
      }
      else {
        auVar46._4_4_ = local_760._4_4_ * auVar269._4_4_;
        auVar46._0_4_ = local_760._0_4_ * auVar269._0_4_;
        auVar46._8_4_ = local_760._8_4_ * auVar269._8_4_;
        auVar46._12_4_ = local_760._12_4_ * auVar269._12_4_;
        auVar46._16_4_ = local_760._16_4_ * auVar269._16_4_;
        auVar46._20_4_ = local_760._20_4_ * auVar269._20_4_;
        auVar46._24_4_ = local_760._24_4_ * auVar269._24_4_;
        auVar46._28_4_ = 0x3e99999a;
        auVar78 = vfmadd213ps_fma(auVar114,local_740,auVar46);
        auVar78 = vfmadd213ps_fma(auVar112,local_720,ZEXT1632(auVar78));
        auVar104 = vandps_avx(ZEXT1632(auVar78),auVar257);
        uVar18 = vcmpps_avx512vl(auVar104,auVar167,1);
        bVar60 = (byte)uVar18 | ~bVar61;
        auVar168._8_4_ = 2;
        auVar168._0_8_ = 0x200000002;
        auVar168._12_4_ = 2;
        auVar168._16_4_ = 2;
        auVar168._20_4_ = 2;
        auVar168._24_4_ = 2;
        auVar168._28_4_ = 2;
        auVar33._8_4_ = 3;
        auVar33._0_8_ = 0x300000003;
        auVar33._12_4_ = 3;
        auVar33._16_4_ = 3;
        auVar33._20_4_ = 3;
        auVar33._24_4_ = 3;
        auVar33._28_4_ = 3;
        auVar104 = vpblendmd_avx512vl(auVar168,auVar33);
        local_5a0._0_4_ = (uint)(bVar60 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar60 & 1) * 2;
        bVar68 = (bool)(bVar60 >> 1 & 1);
        local_5a0._4_4_ = (uint)bVar68 * auVar104._4_4_ | (uint)!bVar68 * 2;
        bVar68 = (bool)(bVar60 >> 2 & 1);
        local_5a0._8_4_ = (uint)bVar68 * auVar104._8_4_ | (uint)!bVar68 * 2;
        bVar68 = (bool)(bVar60 >> 3 & 1);
        local_5a0._12_4_ = (uint)bVar68 * auVar104._12_4_ | (uint)!bVar68 * 2;
        bVar68 = (bool)(bVar60 >> 4 & 1);
        local_5a0._16_4_ = (uint)bVar68 * auVar104._16_4_ | (uint)!bVar68 * 2;
        bVar68 = (bool)(bVar60 >> 5 & 1);
        local_5a0._20_4_ = (uint)bVar68 * auVar104._20_4_ | (uint)!bVar68 * 2;
        bVar68 = (bool)(bVar60 >> 6 & 1);
        local_5a0._24_4_ = (uint)bVar68 * auVar104._24_4_ | (uint)!bVar68 * 2;
        local_5a0._28_4_ = (uint)(bVar60 >> 7) * auVar104._28_4_ | (uint)!(bool)(bVar60 >> 7) * 2;
        local_620 = vpbroadcastd_avx512vl();
        uVar18 = vpcmpd_avx512vl(local_620,local_5a0,5);
        bVar60 = (byte)uVar18 & bVar56;
        if (bVar60 != 0) {
          auVar79 = vminps_avx(local_880._0_16_,local_8c0._0_16_);
          auVar78 = vmaxps_avx(local_880._0_16_,local_8c0._0_16_);
          auVar16 = vminps_avx(local_8a0._0_16_,local_8e0._0_16_);
          auVar80 = vminps_avx(auVar79,auVar16);
          auVar79 = vmaxps_avx(local_8a0._0_16_,local_8e0._0_16_);
          auVar16 = vmaxps_avx(auVar78,auVar79);
          auVar78 = vandps_avx(auVar276,auVar80);
          auVar79 = vandps_avx(auVar276,auVar16);
          auVar78 = vmaxps_avx(auVar78,auVar79);
          auVar79 = vmovshdup_avx(auVar78);
          auVar79 = vmaxss_avx(auVar79,auVar78);
          auVar78 = vshufpd_avx(auVar78,auVar78,1);
          auVar78 = vmaxss_avx(auVar78,auVar79);
          fVar268 = auVar78._0_4_ * 1.9073486e-06;
          local_840 = vshufps_avx(auVar16,auVar16,0xff);
          local_6a0 = (float)local_7a0._0_4_ + (float)local_960._0_4_;
          fStack_69c = (float)local_7a0._4_4_ + (float)local_960._4_4_;
          fStack_698 = fStack_798 + fStack_958;
          fStack_694 = fStack_794 + fStack_954;
          fStack_690 = fStack_790 + fStack_950;
          fStack_68c = fStack_78c + fStack_94c;
          fStack_688 = fStack_788 + fStack_948;
          fStack_684 = fStack_784 + fStack_944;
          do {
            auVar169._8_4_ = 0x7f800000;
            auVar169._0_8_ = 0x7f8000007f800000;
            auVar169._12_4_ = 0x7f800000;
            auVar169._16_4_ = 0x7f800000;
            auVar169._20_4_ = 0x7f800000;
            auVar169._24_4_ = 0x7f800000;
            auVar169._28_4_ = 0x7f800000;
            auVar104 = vblendmps_avx512vl(auVar169,_local_7a0);
            auVar134._0_4_ =
                 (uint)(bVar60 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar60 & 1) * 0x7f800000;
            bVar68 = (bool)(bVar60 >> 1 & 1);
            auVar134._4_4_ = (uint)bVar68 * auVar104._4_4_ | (uint)!bVar68 * 0x7f800000;
            bVar68 = (bool)(bVar60 >> 2 & 1);
            auVar134._8_4_ = (uint)bVar68 * auVar104._8_4_ | (uint)!bVar68 * 0x7f800000;
            bVar68 = (bool)(bVar60 >> 3 & 1);
            auVar134._12_4_ = (uint)bVar68 * auVar104._12_4_ | (uint)!bVar68 * 0x7f800000;
            bVar68 = (bool)(bVar60 >> 4 & 1);
            auVar134._16_4_ = (uint)bVar68 * auVar104._16_4_ | (uint)!bVar68 * 0x7f800000;
            bVar68 = (bool)(bVar60 >> 5 & 1);
            auVar134._20_4_ = (uint)bVar68 * auVar104._20_4_ | (uint)!bVar68 * 0x7f800000;
            auVar134._24_4_ =
                 (uint)(bVar60 >> 6) * auVar104._24_4_ | (uint)!(bool)(bVar60 >> 6) * 0x7f800000;
            auVar134._28_4_ = 0x7f800000;
            auVar275._32_32_ = auVar135;
            auVar275._0_32_ = auVar134;
            auVar135 = vshufps_avx(auVar134,auVar134,0xb1);
            auVar135 = vminps_avx(auVar134,auVar135);
            auVar104 = vshufpd_avx(auVar135,auVar135,5);
            auVar135 = vminps_avx(auVar135,auVar104);
            auVar104 = vpermpd_avx2(auVar135,0x4e);
            auVar135 = vminps_avx(auVar135,auVar104);
            uVar18 = vcmpps_avx512vl(auVar134,auVar135,0);
            bVar55 = (byte)uVar18 & bVar60;
            bVar63 = bVar60;
            if (bVar55 != 0) {
              bVar63 = bVar55;
            }
            iVar20 = 0;
            for (uVar71 = (uint)bVar63; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
              iVar20 = iVar20 + 1;
            }
            bVar63 = '\x01' << ((byte)iVar20 & 0x1f);
            uVar71 = *(uint *)(local_660 + (uint)(iVar20 << 2));
            uVar144 = *(uint *)(local_500 + (uint)(iVar20 << 2));
            fVar270 = auVar75._0_4_;
            if ((float)local_900._0_4_ < 0.0) {
              fVar270 = sqrtf((float)local_900._0_4_);
            }
            auVar174 = ZEXT464(uVar71);
            auVar267 = ZEXT464(uVar144);
            bVar55 = ~bVar63;
            lVar66 = 5;
            do {
              auVar135 = auVar275._32_32_;
              fVar271 = auVar267._0_4_;
              auVar157._4_4_ = fVar271;
              auVar157._0_4_ = fVar271;
              auVar157._8_4_ = fVar271;
              auVar157._12_4_ = fVar271;
              auVar78 = vfmadd132ps_fma(auVar157,ZEXT816(0) << 0x40,local_8f0);
              fVar274 = auVar174._0_4_;
              local_9e0._4_4_ = 1.0 - fVar274;
              fVar258 = (float)local_9e0._4_4_ * (float)local_9e0._4_4_ * (float)local_9e0._4_4_;
              fVar152 = fVar274 * fVar274 * fVar274;
              auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar258),
                                        ZEXT416((uint)fVar152));
              fVar272 = fVar274 * (float)local_9e0._4_4_;
              auVar77 = ZEXT416((uint)local_9e0._4_4_);
              auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar274 * fVar272 * 6.0)),
                                        ZEXT416((uint)(fVar272 * (float)local_9e0._4_4_)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar16 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar152),
                                        ZEXT416((uint)fVar258));
              auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar272 * (float)local_9e0._4_4_ * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar274 * fVar272)));
              fVar258 = fVar258 * 0.16666667;
              fVar259 = (auVar79._0_4_ + auVar80._0_4_) * 0.16666667;
              fVar273 = (auVar16._0_4_ + auVar82._0_4_) * 0.16666667;
              fVar152 = fVar152 * 0.16666667;
              auVar208._0_4_ = fVar152 * (float)local_8e0._0_4_;
              auVar208._4_4_ = fVar152 * (float)local_8e0._4_4_;
              auVar208._8_4_ = fVar152 * fStack_8d8;
              auVar208._12_4_ = fVar152 * fStack_8d4;
              auVar240._4_4_ = fVar273;
              auVar240._0_4_ = fVar273;
              auVar240._8_4_ = fVar273;
              auVar240._12_4_ = fVar273;
              auVar79 = vfmadd132ps_fma(auVar240,auVar208,local_8a0._0_16_);
              auVar209._4_4_ = fVar259;
              auVar209._0_4_ = fVar259;
              auVar209._8_4_ = fVar259;
              auVar209._12_4_ = fVar259;
              auVar79 = vfmadd132ps_fma(auVar209,auVar79,local_8c0._0_16_);
              auVar185._4_4_ = fVar258;
              auVar185._0_4_ = fVar258;
              auVar185._8_4_ = fVar258;
              auVar185._12_4_ = fVar258;
              auVar79 = vfmadd132ps_fma(auVar185,auVar79,local_880._0_16_);
              local_780._0_16_ = auVar79;
              auVar78 = vsubps_avx(auVar78,auVar79);
              local_920._0_16_ = auVar78;
              auVar78 = vdpps_avx(auVar78,auVar78,0x7f);
              auVar79 = auVar174._0_16_;
              local_940._0_16_ = auVar78;
              if (auVar78._0_4_ < 0.0) {
                auVar269._0_4_ = sqrtf(auVar78._0_4_);
                auVar269._4_60_ = extraout_var;
                auVar78 = auVar269._0_16_;
              }
              else {
                auVar78 = vsqrtss_avx(auVar78,auVar78);
              }
              local_9e0._0_4_ = local_9e0._4_4_;
              fStack_9d8 = (float)local_9e0._4_4_;
              fStack_9d4 = (float)local_9e0._4_4_;
              auVar80 = vfnmsub213ss_fma(auVar79,auVar79,ZEXT416((uint)(fVar272 * 4.0)));
              auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar272 * 4.0)),auVar77,auVar77);
              fVar272 = (float)local_9e0._4_4_ * -(float)local_9e0._4_4_ * 0.5;
              fVar258 = auVar80._0_4_ * 0.5;
              fVar259 = auVar16._0_4_ * 0.5;
              fVar273 = fVar274 * fVar274 * 0.5;
              auVar228._0_4_ = fVar273 * (float)local_8e0._0_4_;
              auVar228._4_4_ = fVar273 * (float)local_8e0._4_4_;
              auVar228._8_4_ = fVar273 * fStack_8d8;
              auVar228._12_4_ = fVar273 * fStack_8d4;
              auVar186._4_4_ = fVar259;
              auVar186._0_4_ = fVar259;
              auVar186._8_4_ = fVar259;
              auVar186._12_4_ = fVar259;
              auVar16 = vfmadd132ps_fma(auVar186,auVar228,local_8a0._0_16_);
              auVar210._4_4_ = fVar258;
              auVar210._0_4_ = fVar258;
              auVar210._8_4_ = fVar258;
              auVar210._12_4_ = fVar258;
              auVar16 = vfmadd132ps_fma(auVar210,auVar16,local_8c0._0_16_);
              auVar281._4_4_ = fVar272;
              auVar281._0_4_ = fVar272;
              auVar281._8_4_ = fVar272;
              auVar281._12_4_ = fVar272;
              auVar16 = vfmadd132ps_fma(auVar281,auVar16,local_880._0_16_);
              _local_7c0 = vdpps_avx(auVar16,auVar16,0x7f);
              auVar48._12_4_ = 0;
              auVar48._0_12_ = ZEXT812(0);
              fVar272 = local_7c0._0_4_;
              auVar80 = vrsqrt14ss_avx512f(auVar48 << 0x20,ZEXT416((uint)fVar272));
              fVar258 = auVar80._0_4_;
              local_7d0 = vrcp14ss_avx512f(auVar48 << 0x20,ZEXT416((uint)fVar272));
              auVar80 = vfnmadd213ss_fma(local_7d0,_local_7c0,ZEXT416(0x40000000));
              local_7e0._0_4_ = auVar80._0_4_;
              uVar71 = auVar78._0_4_;
              if (fVar272 < -fVar272) {
                fVar259 = sqrtf(fVar272);
                auVar78 = ZEXT416(uVar71);
              }
              else {
                auVar80 = vsqrtss_avx(_local_7c0,_local_7c0);
                fVar259 = auVar80._0_4_;
              }
              fVar272 = fVar258 * 1.5 + fVar272 * -0.5 * fVar258 * fVar258 * fVar258;
              auVar158._0_4_ = auVar16._0_4_ * fVar272;
              auVar158._4_4_ = auVar16._4_4_ * fVar272;
              auVar158._8_4_ = auVar16._8_4_ * fVar272;
              auVar158._12_4_ = auVar16._12_4_ * fVar272;
              auVar80 = vdpps_avx(local_920._0_16_,auVar158,0x7f);
              fVar273 = auVar78._0_4_;
              auVar159._0_4_ = auVar80._0_4_ * auVar80._0_4_;
              auVar159._4_4_ = auVar80._4_4_ * auVar80._4_4_;
              auVar159._8_4_ = auVar80._8_4_ * auVar80._8_4_;
              auVar159._12_4_ = auVar80._12_4_ * auVar80._12_4_;
              auVar81 = vsubps_avx512vl(local_940._0_16_,auVar159);
              fVar258 = auVar81._0_4_;
              auVar187._4_12_ = ZEXT812(0) << 0x20;
              auVar187._0_4_ = fVar258;
              auVar82 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar187);
              auVar83 = vmulss_avx512f(auVar82,ZEXT416(0x3fc00000));
              if (fVar258 < 0.0) {
                local_810._0_4_ = auVar83._0_4_;
                local_820 = fVar272;
                fStack_81c = fVar272;
                fStack_818 = fVar272;
                fStack_814 = fVar272;
                local_800 = auVar82;
                local_7f0 = auVar80;
                fVar152 = sqrtf(fVar258);
                auVar83 = ZEXT416((uint)local_810._0_4_);
                auVar78 = ZEXT416(uVar71);
                auVar80 = local_7f0;
                auVar82 = local_800;
                fVar272 = local_820;
                fVar245 = fStack_81c;
                fVar204 = fStack_818;
                fVar260 = fStack_814;
              }
              else {
                auVar81 = vsqrtss_avx(auVar81,auVar81);
                fVar152 = auVar81._0_4_;
                fVar245 = fVar272;
                fVar204 = fVar272;
                fVar260 = fVar272;
              }
              auVar283 = ZEXT1664(auVar16);
              auVar269 = ZEXT1664(local_920._0_16_);
              auVar276._8_4_ = 0x7fffffff;
              auVar276._0_8_ = 0x7fffffff7fffffff;
              auVar276._12_4_ = 0x7fffffff;
              auVar250._32_32_ = auVar135;
              auVar250._0_32_ = auVar139._0_32_;
              auVar81 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar77,auVar79);
              auVar79 = vfmadd231ss_fma(auVar77,auVar79,SUB6416(ZEXT464(0xc0000000),0));
              auVar211._0_4_ = fVar274 * (float)local_8e0._0_4_;
              auVar211._4_4_ = fVar274 * (float)local_8e0._4_4_;
              auVar211._8_4_ = fVar274 * fStack_8d8;
              auVar211._12_4_ = fVar274 * fStack_8d4;
              auVar229._0_4_ = auVar79._0_4_;
              auVar229._4_4_ = auVar229._0_4_;
              auVar229._8_4_ = auVar229._0_4_;
              auVar229._12_4_ = auVar229._0_4_;
              auVar79 = vfmadd132ps_fma(auVar229,auVar211,local_8a0._0_16_);
              auVar188._0_4_ = auVar81._0_4_;
              auVar188._4_4_ = auVar188._0_4_;
              auVar188._8_4_ = auVar188._0_4_;
              auVar188._12_4_ = auVar188._0_4_;
              auVar79 = vfmadd132ps_fma(auVar188,auVar79,local_8c0._0_16_);
              auVar79 = vfmadd132ps_fma(_local_9e0,auVar79,local_880._0_16_);
              auVar189._0_4_ = auVar79._0_4_ * (float)local_7c0._0_4_;
              auVar189._4_4_ = auVar79._4_4_ * (float)local_7c0._0_4_;
              auVar189._8_4_ = auVar79._8_4_ * (float)local_7c0._0_4_;
              auVar189._12_4_ = auVar79._12_4_ * (float)local_7c0._0_4_;
              auVar79 = vdpps_avx(auVar16,auVar79,0x7f);
              fVar278 = auVar79._0_4_;
              auVar212._0_4_ = auVar16._0_4_ * fVar278;
              auVar212._4_4_ = auVar16._4_4_ * fVar278;
              auVar212._8_4_ = auVar16._8_4_ * fVar278;
              auVar212._12_4_ = auVar16._12_4_ * fVar278;
              auVar79 = vsubps_avx(auVar189,auVar212);
              fVar278 = (float)local_7e0._0_4_ * (float)local_7d0._0_4_;
              auVar77 = vmaxss_avx(ZEXT416((uint)fVar268),
                                   ZEXT416((uint)(fVar271 * fVar270 * 1.9073486e-06)));
              auVar26._8_4_ = 0x80000000;
              auVar26._0_8_ = 0x8000000080000000;
              auVar26._12_4_ = 0x80000000;
              auVar288._16_48_ = auVar250._16_48_;
              auVar84 = vxorps_avx512vl(auVar16,auVar26);
              auVar213._0_4_ = fVar272 * auVar79._0_4_ * fVar278;
              auVar213._4_4_ = fVar245 * auVar79._4_4_ * fVar278;
              auVar213._8_4_ = fVar204 * auVar79._8_4_ * fVar278;
              auVar213._12_4_ = fVar260 * auVar79._12_4_ * fVar278;
              auVar279 = ZEXT1664(auVar158);
              auVar79 = vdpps_avx(auVar84,auVar158,0x7f);
              auVar81 = vfmadd213ss_fma(auVar78,ZEXT416((uint)fVar268),auVar77);
              auVar78 = vdpps_avx(local_920._0_16_,auVar213,0x7f);
              auVar81 = vfmadd213ss_fma(ZEXT416((uint)(fVar273 + 1.0)),
                                        ZEXT416((uint)(fVar268 / fVar259)),auVar81);
              fVar272 = auVar79._0_4_ + auVar78._0_4_;
              auVar78 = vdpps_avx(local_8f0,auVar158,0x7f);
              auVar79 = vdpps_avx(local_920._0_16_,auVar84,0x7f);
              auVar84 = vmulss_avx512f(auVar82,ZEXT416((uint)(fVar258 * -0.5)));
              auVar82 = vmulss_avx512f(auVar82,auVar82);
              auVar85 = vaddss_avx512f(auVar83,ZEXT416((uint)(auVar84._0_4_ * auVar82._0_4_)));
              auVar82 = vdpps_avx(local_920._0_16_,local_8f0,0x7f);
              auVar83 = vfnmadd231ss_fma(auVar79,auVar80,ZEXT416((uint)fVar272));
              auVar84 = vfnmadd231ss_fma(auVar82,auVar80,auVar78);
              auVar79 = vpermilps_avx(local_780._0_16_,0xff);
              fVar152 = fVar152 - auVar79._0_4_;
              auVar79 = vshufps_avx(auVar16,auVar16,0xff);
              auVar82 = vfmsub213ss_fma(auVar83,auVar85,auVar79);
              fVar258 = auVar84._0_4_ * auVar85._0_4_;
              auVar83 = vfmsub231ss_fma(ZEXT416((uint)(auVar78._0_4_ * auVar82._0_4_)),
                                        ZEXT416((uint)fVar272),ZEXT416((uint)fVar258));
              fVar259 = auVar83._0_4_;
              fVar258 = auVar80._0_4_ * (fVar258 / fVar259) - fVar152 * (auVar78._0_4_ / fVar259);
              auVar250 = ZEXT464((uint)fVar258);
              fVar274 = fVar274 - fVar258;
              auVar174 = ZEXT464((uint)fVar274);
              fVar271 = fVar271 - (fVar152 * (fVar272 / fVar259) -
                                  auVar80._0_4_ * (auVar82._0_4_ / fVar259));
              auVar267 = ZEXT464((uint)fVar271);
              auVar78 = vandps_avx(auVar80,auVar276);
              bVar68 = true;
              if (auVar81._0_4_ <= auVar78._0_4_) {
LAB_01c429ff:
                auVar141._32_32_ = auVar135;
                auVar275 = auVar141;
              }
              else {
                auVar80 = vfmadd231ss_fma(ZEXT416((uint)(auVar81._0_4_ + auVar77._0_4_)),local_840,
                                          ZEXT416(0x36000000));
                auVar78 = vandps_avx(auVar276,ZEXT416((uint)fVar152));
                if (auVar80._0_4_ <= auVar78._0_4_) goto LAB_01c429ff;
                fVar271 = fVar271 + (float)local_830._0_4_;
                auVar267 = ZEXT464((uint)fVar271);
                if ((((fVar271 < fVar175) ||
                     (fVar272 = *(float *)(ray + k * 4 + 0x200), fVar272 < fVar271)) ||
                    (fVar274 < 0.0)) || (1.0 < fVar274)) {
LAB_01c429fc:
                  bVar68 = false;
                  bVar63 = 0;
                  goto LAB_01c429ff;
                }
                auVar288._0_16_ = ZEXT816(0) << 0x20;
                auVar142._4_60_ = auVar288._4_60_;
                auVar142._0_4_ = local_940._0_4_;
                auVar78 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar142._0_16_);
                fVar259 = auVar78._0_4_;
                auVar78 = vmulss_avx512f(local_940._0_16_,ZEXT416(0xbf000000));
                pGVar4 = (context->scene->geometries).items[uVar58].ptr;
                if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) goto LAB_01c429fc;
                auVar275._32_32_ = auVar135;
                auVar275._0_32_ = auVar141._0_32_;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  bVar63 = true;
                }
                else {
                  fVar259 = fVar259 * 1.5 + auVar78._0_4_ * fVar259 * fVar259 * fVar259;
                  auVar190._0_4_ = local_920._0_4_ * fVar259;
                  auVar190._4_4_ = local_920._4_4_ * fVar259;
                  auVar190._8_4_ = local_920._8_4_ * fVar259;
                  auVar190._12_4_ = local_920._12_4_ * fVar259;
                  auVar82 = vfmadd213ps_fma(auVar79,auVar190,auVar16);
                  auVar78 = vshufps_avx(auVar190,auVar190,0xc9);
                  auVar79 = vshufps_avx(auVar16,auVar16,0xc9);
                  auVar191._0_4_ = auVar190._0_4_ * auVar79._0_4_;
                  auVar191._4_4_ = auVar190._4_4_ * auVar79._4_4_;
                  auVar191._8_4_ = auVar190._8_4_ * auVar79._8_4_;
                  auVar191._12_4_ = auVar190._12_4_ * auVar79._12_4_;
                  auVar80 = vfmsub231ps_fma(auVar191,auVar16,auVar78);
                  auVar78 = vshufps_avx(auVar80,auVar80,0xc9);
                  auVar79 = vshufps_avx(auVar82,auVar82,0xc9);
                  auVar80 = vshufps_avx(auVar80,auVar80,0xd2);
                  auVar160._0_4_ = auVar82._0_4_ * auVar80._0_4_;
                  auVar160._4_4_ = auVar82._4_4_ * auVar80._4_4_;
                  auVar160._8_4_ = auVar82._8_4_ * auVar80._8_4_;
                  auVar160._12_4_ = auVar82._12_4_ * auVar80._12_4_;
                  auVar78 = vfmsub231ps_fma(auVar160,auVar78,auVar79);
                  auVar79 = ZEXT416((uint)fVar274);
                  local_340 = vbroadcastss_avx512f(auVar79);
                  auVar221 = vbroadcastss_avx512f(ZEXT416(1));
                  auVar221 = vpermps_avx512f(auVar221,ZEXT1664(auVar78));
                  auVar236 = vbroadcastss_avx512f(ZEXT416(2));
                  local_3c0 = vpermps_avx512f(auVar236,ZEXT1664(auVar78));
                  local_380 = vbroadcastss_avx512f(auVar78);
                  local_400[0] = (RTCHitN)auVar221[0];
                  local_400[1] = (RTCHitN)auVar221[1];
                  local_400[2] = (RTCHitN)auVar221[2];
                  local_400[3] = (RTCHitN)auVar221[3];
                  local_400[4] = (RTCHitN)auVar221[4];
                  local_400[5] = (RTCHitN)auVar221[5];
                  local_400[6] = (RTCHitN)auVar221[6];
                  local_400[7] = (RTCHitN)auVar221[7];
                  local_400[8] = (RTCHitN)auVar221[8];
                  local_400[9] = (RTCHitN)auVar221[9];
                  local_400[10] = (RTCHitN)auVar221[10];
                  local_400[0xb] = (RTCHitN)auVar221[0xb];
                  local_400[0xc] = (RTCHitN)auVar221[0xc];
                  local_400[0xd] = (RTCHitN)auVar221[0xd];
                  local_400[0xe] = (RTCHitN)auVar221[0xe];
                  local_400[0xf] = (RTCHitN)auVar221[0xf];
                  local_400[0x10] = (RTCHitN)auVar221[0x10];
                  local_400[0x11] = (RTCHitN)auVar221[0x11];
                  local_400[0x12] = (RTCHitN)auVar221[0x12];
                  local_400[0x13] = (RTCHitN)auVar221[0x13];
                  local_400[0x14] = (RTCHitN)auVar221[0x14];
                  local_400[0x15] = (RTCHitN)auVar221[0x15];
                  local_400[0x16] = (RTCHitN)auVar221[0x16];
                  local_400[0x17] = (RTCHitN)auVar221[0x17];
                  local_400[0x18] = (RTCHitN)auVar221[0x18];
                  local_400[0x19] = (RTCHitN)auVar221[0x19];
                  local_400[0x1a] = (RTCHitN)auVar221[0x1a];
                  local_400[0x1b] = (RTCHitN)auVar221[0x1b];
                  local_400[0x1c] = (RTCHitN)auVar221[0x1c];
                  local_400[0x1d] = (RTCHitN)auVar221[0x1d];
                  local_400[0x1e] = (RTCHitN)auVar221[0x1e];
                  local_400[0x1f] = (RTCHitN)auVar221[0x1f];
                  local_400[0x20] = (RTCHitN)auVar221[0x20];
                  local_400[0x21] = (RTCHitN)auVar221[0x21];
                  local_400[0x22] = (RTCHitN)auVar221[0x22];
                  local_400[0x23] = (RTCHitN)auVar221[0x23];
                  local_400[0x24] = (RTCHitN)auVar221[0x24];
                  local_400[0x25] = (RTCHitN)auVar221[0x25];
                  local_400[0x26] = (RTCHitN)auVar221[0x26];
                  local_400[0x27] = (RTCHitN)auVar221[0x27];
                  local_400[0x28] = (RTCHitN)auVar221[0x28];
                  local_400[0x29] = (RTCHitN)auVar221[0x29];
                  local_400[0x2a] = (RTCHitN)auVar221[0x2a];
                  local_400[0x2b] = (RTCHitN)auVar221[0x2b];
                  local_400[0x2c] = (RTCHitN)auVar221[0x2c];
                  local_400[0x2d] = (RTCHitN)auVar221[0x2d];
                  local_400[0x2e] = (RTCHitN)auVar221[0x2e];
                  local_400[0x2f] = (RTCHitN)auVar221[0x2f];
                  local_400[0x30] = (RTCHitN)auVar221[0x30];
                  local_400[0x31] = (RTCHitN)auVar221[0x31];
                  local_400[0x32] = (RTCHitN)auVar221[0x32];
                  local_400[0x33] = (RTCHitN)auVar221[0x33];
                  local_400[0x34] = (RTCHitN)auVar221[0x34];
                  local_400[0x35] = (RTCHitN)auVar221[0x35];
                  local_400[0x36] = (RTCHitN)auVar221[0x36];
                  local_400[0x37] = (RTCHitN)auVar221[0x37];
                  local_400[0x38] = (RTCHitN)auVar221[0x38];
                  local_400[0x39] = (RTCHitN)auVar221[0x39];
                  local_400[0x3a] = (RTCHitN)auVar221[0x3a];
                  local_400[0x3b] = (RTCHitN)auVar221[0x3b];
                  local_400[0x3c] = (RTCHitN)auVar221[0x3c];
                  local_400[0x3d] = (RTCHitN)auVar221[0x3d];
                  local_400[0x3e] = (RTCHitN)auVar221[0x3e];
                  local_400[0x3f] = (RTCHitN)auVar221[0x3f];
                  local_300 = 0;
                  uStack_2f8 = 0;
                  uStack_2f0 = 0;
                  uStack_2e8 = 0;
                  uStack_2e0 = 0;
                  uStack_2d8 = 0;
                  uStack_2d0 = 0;
                  uStack_2c8 = 0;
                  local_2c0 = local_440._0_8_;
                  uStack_2b8 = local_440._8_8_;
                  uStack_2b0 = local_440._16_8_;
                  uStack_2a8 = local_440._24_8_;
                  uStack_2a0 = local_440._32_8_;
                  uStack_298 = local_440._40_8_;
                  uStack_290 = local_440._48_8_;
                  uStack_288 = local_440._56_8_;
                  auVar221 = vmovdqa64_avx512f(local_480);
                  local_280 = vmovdqa64_avx512f(auVar221);
                  vpcmpeqd_avx2(auVar221._0_32_,auVar221._0_32_);
                  local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                  local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                  *(float *)(ray + k * 4 + 0x200) = fVar271;
                  local_700 = local_4c0;
                  local_9b0.valid = (int *)local_700;
                  local_9b0.geometryUserPtr = pGVar4->userPtr;
                  local_9b0.context = context->user;
                  local_9b0.hit = local_400;
                  local_9b0.N = 0x10;
                  local_9b0.ray = (RTCRayN *)ray;
                  if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar250 = ZEXT464((uint)fVar258);
                    auVar269 = ZEXT1664(local_920._0_16_);
                    auVar279 = ZEXT1664(auVar158);
                    auVar283 = ZEXT1664(auVar16);
                    (*pGVar4->occlusionFilterN)(&local_9b0);
                    auVar267 = ZEXT1664(ZEXT416((uint)fVar271));
                    auVar174 = ZEXT1664(auVar79);
                    auVar276._8_4_ = 0x7fffffff;
                    auVar276._0_8_ = 0x7fffffff7fffffff;
                    auVar276._12_4_ = 0x7fffffff;
                  }
                  auVar275 = vmovdqa64_avx512f(local_700);
                  uVar18 = vptestmd_avx512f(auVar275,auVar275);
                  if ((short)uVar18 == 0) {
                    bVar63 = false;
                  }
                  else {
                    p_Var8 = context->args->filter;
                    if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar250 = ZEXT1664(auVar250._0_16_);
                      auVar269 = ZEXT1664(auVar269._0_16_);
                      auVar279 = ZEXT1664(auVar279._0_16_);
                      auVar283 = ZEXT1664(auVar283._0_16_);
                      (*p_Var8)(&local_9b0);
                      auVar267 = ZEXT1664(ZEXT416((uint)fVar271));
                      auVar174 = ZEXT1664(auVar79);
                      auVar276._8_4_ = 0x7fffffff;
                      auVar276._0_8_ = 0x7fffffff7fffffff;
                      auVar276._12_4_ = 0x7fffffff;
                    }
                    auVar221 = vmovdqa64_avx512f(local_700);
                    uVar70 = vptestmd_avx512f(auVar221,auVar221);
                    auVar221 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                    bVar68 = (bool)((byte)uVar70 & 1);
                    auVar275._0_4_ =
                         (uint)bVar68 * auVar221._0_4_ |
                         (uint)!bVar68 * *(int *)(local_9b0.ray + 0x200);
                    bVar68 = (bool)((byte)(uVar70 >> 1) & 1);
                    auVar275._4_4_ =
                         (uint)bVar68 * auVar221._4_4_ |
                         (uint)!bVar68 * *(int *)(local_9b0.ray + 0x204);
                    bVar68 = (bool)((byte)(uVar70 >> 2) & 1);
                    auVar275._8_4_ =
                         (uint)bVar68 * auVar221._8_4_ |
                         (uint)!bVar68 * *(int *)(local_9b0.ray + 0x208);
                    bVar68 = (bool)((byte)(uVar70 >> 3) & 1);
                    auVar275._12_4_ =
                         (uint)bVar68 * auVar221._12_4_ |
                         (uint)!bVar68 * *(int *)(local_9b0.ray + 0x20c);
                    bVar68 = (bool)((byte)(uVar70 >> 4) & 1);
                    auVar275._16_4_ =
                         (uint)bVar68 * auVar221._16_4_ |
                         (uint)!bVar68 * *(int *)(local_9b0.ray + 0x210);
                    bVar68 = (bool)((byte)(uVar70 >> 5) & 1);
                    auVar275._20_4_ =
                         (uint)bVar68 * auVar221._20_4_ |
                         (uint)!bVar68 * *(int *)(local_9b0.ray + 0x214);
                    bVar68 = (bool)((byte)(uVar70 >> 6) & 1);
                    auVar275._24_4_ =
                         (uint)bVar68 * auVar221._24_4_ |
                         (uint)!bVar68 * *(int *)(local_9b0.ray + 0x218);
                    bVar68 = (bool)((byte)(uVar70 >> 7) & 1);
                    auVar275._28_4_ =
                         (uint)bVar68 * auVar221._28_4_ |
                         (uint)!bVar68 * *(int *)(local_9b0.ray + 0x21c);
                    bVar68 = (bool)((byte)(uVar70 >> 8) & 1);
                    auVar275._32_4_ =
                         (uint)bVar68 * auVar221._32_4_ |
                         (uint)!bVar68 * *(int *)(local_9b0.ray + 0x220);
                    bVar68 = (bool)((byte)(uVar70 >> 9) & 1);
                    auVar275._36_4_ =
                         (uint)bVar68 * auVar221._36_4_ |
                         (uint)!bVar68 * *(int *)(local_9b0.ray + 0x224);
                    bVar68 = (bool)((byte)(uVar70 >> 10) & 1);
                    auVar275._40_4_ =
                         (uint)bVar68 * auVar221._40_4_ |
                         (uint)!bVar68 * *(int *)(local_9b0.ray + 0x228);
                    bVar68 = (bool)((byte)(uVar70 >> 0xb) & 1);
                    auVar275._44_4_ =
                         (uint)bVar68 * auVar221._44_4_ |
                         (uint)!bVar68 * *(int *)(local_9b0.ray + 0x22c);
                    bVar68 = (bool)((byte)(uVar70 >> 0xc) & 1);
                    auVar275._48_4_ =
                         (uint)bVar68 * auVar221._48_4_ |
                         (uint)!bVar68 * *(int *)(local_9b0.ray + 0x230);
                    bVar68 = (bool)((byte)(uVar70 >> 0xd) & 1);
                    auVar275._52_4_ =
                         (uint)bVar68 * auVar221._52_4_ |
                         (uint)!bVar68 * *(int *)(local_9b0.ray + 0x234);
                    bVar68 = (bool)((byte)(uVar70 >> 0xe) & 1);
                    auVar275._56_4_ =
                         (uint)bVar68 * auVar221._56_4_ |
                         (uint)!bVar68 * *(int *)(local_9b0.ray + 0x238);
                    bVar68 = SUB81(uVar70 >> 0xf,0);
                    auVar275._60_4_ =
                         (uint)bVar68 * auVar221._60_4_ |
                         (uint)!bVar68 * *(int *)(local_9b0.ray + 0x23c);
                    *(undefined1 (*) [64])(local_9b0.ray + 0x200) = auVar275;
                    bVar63 = (short)uVar70 != 0;
                  }
                  if ((bool)bVar63 == false) {
                    *(float *)(ray + k * 4 + 0x200) = fVar272;
                  }
                }
                bVar68 = false;
              }
              if (!bVar68) goto LAB_01c42dfb;
              lVar66 = lVar66 + -1;
            } while (lVar66 != 0);
            bVar63 = 0;
LAB_01c42dfb:
            bVar62 = bVar62 | bVar63 & 1;
            auVar51._4_4_ = fStack_69c;
            auVar51._0_4_ = local_6a0;
            auVar51._8_4_ = fStack_698;
            auVar51._12_4_ = fStack_694;
            auVar51._16_4_ = fStack_690;
            auVar51._20_4_ = fStack_68c;
            auVar51._24_4_ = fStack_688;
            auVar51._28_4_ = fStack_684;
            uVar2 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar34._4_4_ = uVar2;
            auVar34._0_4_ = uVar2;
            auVar34._8_4_ = uVar2;
            auVar34._12_4_ = uVar2;
            auVar34._16_4_ = uVar2;
            auVar34._20_4_ = uVar2;
            auVar34._24_4_ = uVar2;
            auVar34._28_4_ = uVar2;
            uVar18 = vcmpps_avx512vl(auVar51,auVar34,2);
            bVar60 = bVar55 & bVar60 & (byte)uVar18;
            auVar135 = auVar275._32_32_;
          } while (bVar60 != 0);
        }
        auVar275 = ZEXT3264(_local_960);
        auVar170._0_4_ = local_960._0_4_ + (float)local_6c0._0_4_;
        auVar170._4_4_ = local_960._4_4_ + (float)local_6c0._4_4_;
        auVar170._8_4_ = local_960._8_4_ + fStack_6b8;
        auVar170._12_4_ = local_960._12_4_ + fStack_6b4;
        auVar170._16_4_ = local_960._16_4_ + fStack_6b0;
        auVar170._20_4_ = local_960._20_4_ + fStack_6ac;
        auVar170._24_4_ = local_960._24_4_ + fStack_6a8;
        auVar170._28_4_ = local_960._28_4_ + fStack_6a4;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar35._4_4_ = uVar2;
        auVar35._0_4_ = uVar2;
        auVar35._8_4_ = uVar2;
        auVar35._12_4_ = uVar2;
        auVar35._16_4_ = uVar2;
        auVar35._20_4_ = uVar2;
        auVar35._24_4_ = uVar2;
        auVar35._28_4_ = uVar2;
        uVar18 = vcmpps_avx512vl(auVar170,auVar35,2);
        bVar61 = (byte)uVar17 | ~bVar61;
        bVar54 = (byte)uVar19 & bVar54 & (byte)uVar18;
        auVar171._8_4_ = 2;
        auVar171._0_8_ = 0x200000002;
        auVar171._12_4_ = 2;
        auVar171._16_4_ = 2;
        auVar171._20_4_ = 2;
        auVar171._24_4_ = 2;
        auVar171._28_4_ = 2;
        auVar36._8_4_ = 3;
        auVar36._0_8_ = 0x300000003;
        auVar36._12_4_ = 3;
        auVar36._16_4_ = 3;
        auVar36._20_4_ = 3;
        auVar36._24_4_ = 3;
        auVar36._28_4_ = 3;
        auVar104 = vpblendmd_avx512vl(auVar171,auVar36);
        local_6c0._0_4_ = (uint)(bVar61 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar61 & 1) * 2;
        bVar68 = (bool)(bVar61 >> 1 & 1);
        local_6c0._4_4_ = (uint)bVar68 * auVar104._4_4_ | (uint)!bVar68 * 2;
        bVar68 = (bool)(bVar61 >> 2 & 1);
        fStack_6b8 = (float)((uint)bVar68 * auVar104._8_4_ | (uint)!bVar68 * 2);
        bVar68 = (bool)(bVar61 >> 3 & 1);
        fStack_6b4 = (float)((uint)bVar68 * auVar104._12_4_ | (uint)!bVar68 * 2);
        bVar68 = (bool)(bVar61 >> 4 & 1);
        fStack_6b0 = (float)((uint)bVar68 * auVar104._16_4_ | (uint)!bVar68 * 2);
        bVar68 = (bool)(bVar61 >> 5 & 1);
        fStack_6ac = (float)((uint)bVar68 * auVar104._20_4_ | (uint)!bVar68 * 2);
        bVar68 = (bool)(bVar61 >> 6 & 1);
        fStack_6a8 = (float)((uint)bVar68 * auVar104._24_4_ | (uint)!bVar68 * 2);
        fStack_6a4 = (float)((uint)(bVar61 >> 7) * auVar104._28_4_ | (uint)!(bool)(bVar61 >> 7) * 2)
        ;
        auVar143._32_32_ = auVar135;
        auVar143._0_32_ = _local_6c0;
        uVar17 = vpcmpd_avx512vl(_local_6c0,local_620,2);
        bVar61 = (byte)uVar17 & bVar54;
        if (bVar61 == 0) {
          auVar143._0_32_ = local_980;
          auVar288 = ZEXT3264(local_980);
        }
        else {
          auVar79 = vminps_avx(local_880._0_16_,local_8c0._0_16_);
          auVar78 = vmaxps_avx(local_880._0_16_,local_8c0._0_16_);
          auVar16 = vminps_avx(local_8a0._0_16_,local_8e0._0_16_);
          auVar80 = vminps_avx(auVar79,auVar16);
          auVar79 = vmaxps_avx(local_8a0._0_16_,local_8e0._0_16_);
          auVar16 = vmaxps_avx(auVar78,auVar79);
          auVar78 = vandps_avx(auVar276,auVar80);
          auVar79 = vandps_avx(auVar276,auVar16);
          auVar78 = vmaxps_avx(auVar78,auVar79);
          auVar79 = vmovshdup_avx(auVar78);
          auVar79 = vmaxss_avx(auVar79,auVar78);
          auVar78 = vshufpd_avx(auVar78,auVar78,1);
          auVar78 = vmaxss_avx(auVar78,auVar79);
          local_7f0._0_4_ = auVar78._0_4_ * 1.9073486e-06;
          local_840 = vshufps_avx(auVar16,auVar16,0xff);
          _local_7a0 = _local_5e0;
          local_6a0 = local_960._0_4_ + (float)local_5e0._0_4_;
          fStack_69c = local_960._4_4_ + (float)local_5e0._4_4_;
          fStack_698 = local_960._8_4_ + fStack_5d8;
          fStack_694 = local_960._12_4_ + fStack_5d4;
          fStack_690 = local_960._16_4_ + fStack_5d0;
          fStack_68c = local_960._20_4_ + fStack_5cc;
          fStack_688 = local_960._24_4_ + fStack_5c8;
          fStack_684 = local_960._28_4_ + fStack_5c4;
          do {
            auVar172._8_4_ = 0x7f800000;
            auVar172._0_8_ = 0x7f8000007f800000;
            auVar172._12_4_ = 0x7f800000;
            auVar172._16_4_ = 0x7f800000;
            auVar172._20_4_ = 0x7f800000;
            auVar172._24_4_ = 0x7f800000;
            auVar172._28_4_ = 0x7f800000;
            auVar135 = vblendmps_avx512vl(auVar172,_local_7a0);
            auVar136._0_4_ =
                 (uint)(bVar61 & 1) * auVar135._0_4_ | (uint)!(bool)(bVar61 & 1) * 0x7f800000;
            bVar68 = (bool)(bVar61 >> 1 & 1);
            auVar136._4_4_ = (uint)bVar68 * auVar135._4_4_ | (uint)!bVar68 * 0x7f800000;
            bVar68 = (bool)(bVar61 >> 2 & 1);
            auVar136._8_4_ = (uint)bVar68 * auVar135._8_4_ | (uint)!bVar68 * 0x7f800000;
            bVar68 = (bool)(bVar61 >> 3 & 1);
            auVar136._12_4_ = (uint)bVar68 * auVar135._12_4_ | (uint)!bVar68 * 0x7f800000;
            bVar68 = (bool)(bVar61 >> 4 & 1);
            auVar136._16_4_ = (uint)bVar68 * auVar135._16_4_ | (uint)!bVar68 * 0x7f800000;
            bVar68 = (bool)(bVar61 >> 5 & 1);
            auVar136._20_4_ = (uint)bVar68 * auVar135._20_4_ | (uint)!bVar68 * 0x7f800000;
            auVar136._24_4_ =
                 (uint)(bVar61 >> 6) * auVar135._24_4_ | (uint)!(bool)(bVar61 >> 6) * 0x7f800000;
            auVar136._28_4_ = 0x7f800000;
            auVar143._0_32_ = auVar136;
            auVar135 = vshufps_avx(auVar136,auVar136,0xb1);
            auVar135 = vminps_avx(auVar136,auVar135);
            auVar104 = vshufpd_avx(auVar135,auVar135,5);
            auVar135 = vminps_avx(auVar135,auVar104);
            auVar104 = vpermpd_avx2(auVar135,0x4e);
            auVar135 = vminps_avx(auVar135,auVar104);
            uVar17 = vcmpps_avx512vl(auVar136,auVar135,0);
            bVar63 = (byte)uVar17 & bVar61;
            bVar60 = bVar61;
            if (bVar63 != 0) {
              bVar60 = bVar63;
            }
            iVar20 = 0;
            for (uVar71 = (uint)bVar60; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
              iVar20 = iVar20 + 1;
            }
            bVar60 = '\x01' << ((byte)iVar20 & 0x1f);
            uVar71 = *(uint *)(local_680 + (uint)(iVar20 << 2));
            uVar144 = *(uint *)(local_5c0 + (uint)(iVar20 << 2));
            fVar268 = auVar76._0_4_;
            if ((float)local_900._0_4_ < 0.0) {
              fVar268 = sqrtf((float)local_900._0_4_);
            }
            auVar279 = ZEXT464(uVar144);
            auVar174 = ZEXT464(uVar71);
            bVar63 = ~bVar60;
            lVar66 = 5;
            do {
              auVar135 = auVar143._32_32_;
              fVar270 = auVar279._0_4_;
              auVar161._4_4_ = fVar270;
              auVar161._0_4_ = fVar270;
              auVar161._8_4_ = fVar270;
              auVar161._12_4_ = fVar270;
              auVar78 = vfmadd132ps_fma(auVar161,ZEXT816(0) << 0x40,local_8f0);
              fVar274 = auVar174._0_4_;
              fVar152 = 1.0 - fVar274;
              fVar272 = fVar152 * fVar152 * fVar152;
              fVar273 = fVar274 * fVar274 * fVar274;
              auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar272),
                                        ZEXT416((uint)fVar273));
              fVar271 = fVar274 * fVar152;
              auVar77 = ZEXT416((uint)fVar152);
              auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar274 * fVar271 * 6.0)),
                                        ZEXT416((uint)(fVar271 * fVar152)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar16 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar273),
                                        ZEXT416((uint)fVar272));
              auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar271 * fVar152 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar274 * fVar271)));
              fVar272 = fVar272 * 0.16666667;
              fVar258 = (auVar79._0_4_ + auVar80._0_4_) * 0.16666667;
              fVar259 = (auVar16._0_4_ + auVar82._0_4_) * 0.16666667;
              fVar273 = fVar273 * 0.16666667;
              auVar214._0_4_ = fVar273 * (float)local_8e0._0_4_;
              auVar214._4_4_ = fVar273 * (float)local_8e0._4_4_;
              auVar214._8_4_ = fVar273 * fStack_8d8;
              auVar214._12_4_ = fVar273 * fStack_8d4;
              auVar241._4_4_ = fVar259;
              auVar241._0_4_ = fVar259;
              auVar241._8_4_ = fVar259;
              auVar241._12_4_ = fVar259;
              auVar79 = vfmadd132ps_fma(auVar241,auVar214,local_8a0._0_16_);
              auVar215._4_4_ = fVar258;
              auVar215._0_4_ = fVar258;
              auVar215._8_4_ = fVar258;
              auVar215._12_4_ = fVar258;
              auVar79 = vfmadd132ps_fma(auVar215,auVar79,local_8c0._0_16_);
              auVar192._4_4_ = fVar272;
              auVar192._0_4_ = fVar272;
              auVar192._8_4_ = fVar272;
              auVar192._12_4_ = fVar272;
              auVar79 = vfmadd132ps_fma(auVar192,auVar79,local_880._0_16_);
              local_780._0_16_ = auVar79;
              auVar78 = vsubps_avx(auVar78,auVar79);
              local_920._0_16_ = auVar78;
              auVar78 = vdpps_avx(auVar78,auVar78,0x7f);
              auVar79 = auVar174._0_16_;
              local_940._0_16_ = auVar78;
              if (auVar78._0_4_ < 0.0) {
                auVar267._0_4_ = sqrtf(auVar78._0_4_);
                auVar267._4_60_ = extraout_var_00;
                auVar78 = auVar267._0_16_;
              }
              else {
                auVar78 = vsqrtss_avx(auVar78,auVar78);
              }
              local_7c0._4_4_ = fVar152;
              local_7c0._0_4_ = fVar152;
              fStack_7b8 = fVar152;
              fStack_7b4 = fVar152;
              auVar80 = vfnmsub213ss_fma(auVar79,auVar79,ZEXT416((uint)(fVar271 * 4.0)));
              auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar271 * 4.0)),auVar77,auVar77);
              fVar271 = fVar152 * -fVar152 * 0.5;
              fVar272 = auVar80._0_4_ * 0.5;
              fVar258 = auVar16._0_4_ * 0.5;
              fVar259 = fVar274 * fVar274 * 0.5;
              auVar230._0_4_ = fVar259 * (float)local_8e0._0_4_;
              auVar230._4_4_ = fVar259 * (float)local_8e0._4_4_;
              auVar230._8_4_ = fVar259 * fStack_8d8;
              auVar230._12_4_ = fVar259 * fStack_8d4;
              auVar193._4_4_ = fVar258;
              auVar193._0_4_ = fVar258;
              auVar193._8_4_ = fVar258;
              auVar193._12_4_ = fVar258;
              auVar16 = vfmadd132ps_fma(auVar193,auVar230,local_8a0._0_16_);
              auVar216._4_4_ = fVar272;
              auVar216._0_4_ = fVar272;
              auVar216._8_4_ = fVar272;
              auVar216._12_4_ = fVar272;
              auVar16 = vfmadd132ps_fma(auVar216,auVar16,local_8c0._0_16_);
              auVar287._4_4_ = fVar271;
              auVar287._0_4_ = fVar271;
              auVar287._8_4_ = fVar271;
              auVar287._12_4_ = fVar271;
              auVar16 = vfmadd132ps_fma(auVar287,auVar16,local_880._0_16_);
              local_7d0 = vdpps_avx(auVar16,auVar16,0x7f);
              auVar49._12_4_ = 0;
              auVar49._0_12_ = ZEXT812(0);
              fVar271 = local_7d0._0_4_;
              auVar80 = vrsqrt14ss_avx512f(auVar49 << 0x20,ZEXT416((uint)fVar271));
              fVar272 = auVar80._0_4_;
              local_7e0 = vrcp14ss_avx512f(auVar49 << 0x20,ZEXT416((uint)fVar271));
              auVar80 = vfnmadd213ss_fma(local_7e0,local_7d0,ZEXT416(0x40000000));
              uVar71 = auVar78._0_4_;
              if (fVar271 < -fVar271) {
                fVar258 = sqrtf(fVar271);
                auVar78 = ZEXT416(uVar71);
              }
              else {
                auVar82 = vsqrtss_avx(local_7d0,local_7d0);
                fVar258 = auVar82._0_4_;
              }
              fVar271 = fVar272 * 1.5 + fVar271 * -0.5 * fVar272 * fVar272 * fVar272;
              auVar162._0_4_ = auVar16._0_4_ * fVar271;
              auVar162._4_4_ = auVar16._4_4_ * fVar271;
              auVar162._8_4_ = auVar16._8_4_ * fVar271;
              auVar162._12_4_ = auVar16._12_4_ * fVar271;
              auVar82 = vdpps_avx(local_920._0_16_,auVar162,0x7f);
              auVar84 = vaddss_avx512f(auVar78,ZEXT416(0x3f800000));
              auVar163._0_4_ = auVar82._0_4_ * auVar82._0_4_;
              auVar163._4_4_ = auVar82._4_4_ * auVar82._4_4_;
              auVar163._8_4_ = auVar82._8_4_ * auVar82._8_4_;
              auVar163._12_4_ = auVar82._12_4_ * auVar82._12_4_;
              auVar81 = vsubps_avx(local_940._0_16_,auVar163);
              fVar272 = auVar81._0_4_;
              auVar194._4_12_ = ZEXT812(0) << 0x20;
              auVar194._0_4_ = fVar272;
              auVar83 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar194);
              auVar85 = vmulss_avx512f(auVar83,ZEXT416(0x3fc00000));
              uVar69 = fVar272 == 0.0;
              uVar67 = fVar272 < 0.0;
              if ((bool)uVar67) {
                local_800._0_4_ = fVar258;
                local_820 = fVar271;
                fStack_81c = fVar271;
                fStack_818 = fVar271;
                fStack_814 = fVar271;
                local_810 = auVar83;
                fVar259 = sqrtf(fVar272);
                auVar84 = ZEXT416(auVar84._0_4_);
                auVar78 = ZEXT416(uVar71);
                auVar83 = local_810;
                fVar271 = local_820;
                fVar273 = fStack_81c;
                fVar152 = fStack_818;
                fVar245 = fStack_814;
                fVar258 = (float)local_800._0_4_;
              }
              else {
                auVar81 = vsqrtss_avx(auVar81,auVar81);
                fVar259 = auVar81._0_4_;
                fVar273 = fVar271;
                fVar152 = fVar271;
                fVar245 = fVar271;
              }
              auVar283 = ZEXT1664(local_920._0_16_);
              auVar266._8_4_ = 0x7fffffff;
              auVar266._0_8_ = 0x7fffffff7fffffff;
              auVar266._12_4_ = 0x7fffffff;
              auVar267 = ZEXT1664(auVar266);
              auVar275 = ZEXT3264(_local_960);
              auVar288 = ZEXT3264(local_980);
              auVar279._32_32_ = auVar135;
              auVar279._0_32_ = auVar139._0_32_;
              auVar81 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar77,auVar79);
              auVar79 = vfmadd231ss_fma(auVar77,auVar79,SUB6416(ZEXT464(0xc0000000),0));
              auVar217._0_4_ = fVar274 * (float)local_8e0._0_4_;
              auVar217._4_4_ = fVar274 * (float)local_8e0._4_4_;
              auVar217._8_4_ = fVar274 * fStack_8d8;
              auVar217._12_4_ = fVar274 * fStack_8d4;
              auVar231._0_4_ = auVar79._0_4_;
              auVar231._4_4_ = auVar231._0_4_;
              auVar231._8_4_ = auVar231._0_4_;
              auVar231._12_4_ = auVar231._0_4_;
              auVar79 = vfmadd132ps_fma(auVar231,auVar217,local_8a0._0_16_);
              auVar195._0_4_ = auVar81._0_4_;
              auVar195._4_4_ = auVar195._0_4_;
              auVar195._8_4_ = auVar195._0_4_;
              auVar195._12_4_ = auVar195._0_4_;
              auVar79 = vfmadd132ps_fma(auVar195,auVar79,local_8c0._0_16_);
              auVar79 = vfmadd132ps_fma(_local_7c0,auVar79,local_880._0_16_);
              auVar196._0_4_ = auVar79._0_4_ * (float)local_7d0._0_4_;
              auVar196._4_4_ = auVar79._4_4_ * (float)local_7d0._0_4_;
              auVar196._8_4_ = auVar79._8_4_ * (float)local_7d0._0_4_;
              auVar196._12_4_ = auVar79._12_4_ * (float)local_7d0._0_4_;
              auVar79 = vdpps_avx(auVar16,auVar79,0x7f);
              fVar204 = auVar79._0_4_;
              auVar218._0_4_ = auVar16._0_4_ * fVar204;
              auVar218._4_4_ = auVar16._4_4_ * fVar204;
              auVar218._8_4_ = auVar16._8_4_ * fVar204;
              auVar218._12_4_ = auVar16._12_4_ * fVar204;
              auVar79 = vsubps_avx(auVar196,auVar218);
              fVar204 = auVar80._0_4_ * (float)local_7e0._0_4_;
              auVar77 = vmaxss_avx(ZEXT416((uint)local_7f0._0_4_),
                                   ZEXT416((uint)(fVar270 * fVar268 * 1.9073486e-06)));
              auVar27._8_4_ = 0x80000000;
              auVar27._0_8_ = 0x8000000080000000;
              auVar27._12_4_ = 0x80000000;
              auVar143._16_48_ = auVar279._16_48_;
              auVar81 = vxorps_avx512vl(auVar16,auVar27);
              auVar219._0_4_ = fVar271 * auVar79._0_4_ * fVar204;
              auVar219._4_4_ = fVar273 * auVar79._4_4_ * fVar204;
              auVar219._8_4_ = fVar152 * auVar79._8_4_ * fVar204;
              auVar219._12_4_ = fVar245 * auVar79._12_4_ * fVar204;
              auVar269 = ZEXT1664(auVar162);
              auVar79 = vdpps_avx(auVar81,auVar162,0x7f);
              auVar80 = vfmadd213ss_fma(auVar78,ZEXT416((uint)local_7f0._0_4_),auVar77);
              auVar78 = vdpps_avx(local_920._0_16_,auVar219,0x7f);
              vfmadd213ss_avx512f(auVar84,ZEXT416((uint)((float)local_7f0._0_4_ / fVar258)),auVar80)
              ;
              fVar271 = auVar79._0_4_ + auVar78._0_4_;
              auVar78 = vdpps_avx(local_8f0,auVar162,0x7f);
              auVar79 = vdpps_avx(local_920._0_16_,auVar81,0x7f);
              auVar80 = vmulss_avx512f(auVar83,ZEXT416((uint)(fVar272 * -0.5)));
              auVar81 = vmulss_avx512f(auVar83,auVar83);
              fVar272 = auVar80._0_4_ * auVar81._0_4_ + auVar85._0_4_;
              auVar80 = vdpps_avx(local_920._0_16_,local_8f0,0x7f);
              auVar81 = vfnmadd231ss_avx512f(auVar79,auVar82,ZEXT416((uint)fVar271));
              auVar83 = vfnmadd231ss_avx512f(auVar80,auVar82,auVar78);
              auVar79 = vpermilps_avx(local_780._0_16_,0xff);
              fVar259 = fVar259 - auVar79._0_4_;
              auVar79 = vshufps_avx(auVar16,auVar16,0xff);
              auVar80 = vfmsub213ss_fma(auVar81,ZEXT416((uint)fVar272),auVar79);
              fVar272 = auVar83._0_4_ * fVar272;
              auVar81 = vfmsub231ss_fma(ZEXT416((uint)(auVar78._0_4_ * auVar80._0_4_)),
                                        ZEXT416((uint)fVar271),ZEXT416((uint)fVar272));
              fVar258 = auVar81._0_4_;
              auVar256._0_4_ = fVar272 / fVar258;
              auVar256._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar232._0_4_ = auVar80._0_4_ / fVar258;
              auVar232._4_12_ = auVar80._4_12_;
              auVar80 = vmulss_avx512f(auVar82,auVar256);
              fVar272 = auVar80._0_4_ - fVar259 * (auVar78._0_4_ / fVar258);
              auVar250 = ZEXT464((uint)fVar272);
              auVar78 = vmulss_avx512f(auVar82,auVar232);
              fVar274 = fVar274 - fVar272;
              auVar174 = ZEXT464((uint)fVar274);
              fVar270 = fVar270 - (fVar259 * (fVar271 / fVar258) - auVar78._0_4_);
              auVar279 = ZEXT464((uint)fVar270);
              auVar143._0_16_ = vandps_avx512vl(auVar82,auVar266);
              auVar78 = vucomiss_avx512f(auVar143._0_16_);
              bVar68 = true;
              if (!(bool)uVar67 && !(bool)uVar69) {
                auVar143._0_16_ = vaddss_avx512f(auVar77,auVar78);
                auVar80 = vfmadd231ss_fma(auVar143._0_16_,local_840,ZEXT416(0x36000000));
                auVar78 = vandps_avx(auVar266,ZEXT416((uint)fVar259));
                if (auVar78._0_4_ < auVar80._0_4_) {
                  fVar270 = fVar270 + (float)local_830._0_4_;
                  auVar279 = ZEXT464((uint)fVar270);
                  if ((((fVar175 <= fVar270) &&
                       (fVar271 = *(float *)(ray + k * 4 + 0x200), fVar270 <= fVar271)) &&
                      (0.0 <= fVar274)) && (fVar274 <= 1.0)) {
                    auVar50._12_4_ = 0;
                    auVar50._0_12_ = ZEXT812(0);
                    auVar143._0_16_ =
                         vrsqrt14ss_avx512f(auVar50 << 0x20,ZEXT416((uint)local_940._0_4_));
                    fVar258 = auVar143._0_4_;
                    pGVar4 = (context->scene->geometries).items[uVar58].ptr;
                    if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        bVar60 = true;
                      }
                      else {
                        fVar258 = fVar258 * 1.5 +
                                  local_940._0_4_ * -0.5 * fVar258 * fVar258 * fVar258;
                        auVar197._0_4_ = local_920._0_4_ * fVar258;
                        auVar197._4_4_ = local_920._4_4_ * fVar258;
                        auVar197._8_4_ = local_920._8_4_ * fVar258;
                        auVar197._12_4_ = local_920._12_4_ * fVar258;
                        auVar80 = vfmadd213ps_fma(auVar79,auVar197,auVar16);
                        auVar78 = vshufps_avx(auVar197,auVar197,0xc9);
                        auVar79 = vshufps_avx(auVar16,auVar16,0xc9);
                        auVar198._0_4_ = auVar197._0_4_ * auVar79._0_4_;
                        auVar198._4_4_ = auVar197._4_4_ * auVar79._4_4_;
                        auVar198._8_4_ = auVar197._8_4_ * auVar79._8_4_;
                        auVar198._12_4_ = auVar197._12_4_ * auVar79._12_4_;
                        auVar16 = vfmsub231ps_fma(auVar198,auVar16,auVar78);
                        auVar78 = vshufps_avx(auVar16,auVar16,0xc9);
                        auVar79 = vshufps_avx(auVar80,auVar80,0xc9);
                        auVar16 = vshufps_avx(auVar16,auVar16,0xd2);
                        auVar164._0_4_ = auVar80._0_4_ * auVar16._0_4_;
                        auVar164._4_4_ = auVar80._4_4_ * auVar16._4_4_;
                        auVar164._8_4_ = auVar80._8_4_ * auVar16._8_4_;
                        auVar164._12_4_ = auVar80._12_4_ * auVar16._12_4_;
                        auVar78 = vfmsub231ps_fma(auVar164,auVar78,auVar79);
                        auVar79 = ZEXT416((uint)fVar274);
                        local_340 = vbroadcastss_avx512f(auVar79);
                        auVar221 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar221 = vpermps_avx512f(auVar221,ZEXT1664(auVar78));
                        auVar236 = vbroadcastss_avx512f(ZEXT416(2));
                        local_3c0 = vpermps_avx512f(auVar236,ZEXT1664(auVar78));
                        local_380 = vbroadcastss_avx512f(auVar78);
                        local_400[0] = (RTCHitN)auVar221[0];
                        local_400[1] = (RTCHitN)auVar221[1];
                        local_400[2] = (RTCHitN)auVar221[2];
                        local_400[3] = (RTCHitN)auVar221[3];
                        local_400[4] = (RTCHitN)auVar221[4];
                        local_400[5] = (RTCHitN)auVar221[5];
                        local_400[6] = (RTCHitN)auVar221[6];
                        local_400[7] = (RTCHitN)auVar221[7];
                        local_400[8] = (RTCHitN)auVar221[8];
                        local_400[9] = (RTCHitN)auVar221[9];
                        local_400[10] = (RTCHitN)auVar221[10];
                        local_400[0xb] = (RTCHitN)auVar221[0xb];
                        local_400[0xc] = (RTCHitN)auVar221[0xc];
                        local_400[0xd] = (RTCHitN)auVar221[0xd];
                        local_400[0xe] = (RTCHitN)auVar221[0xe];
                        local_400[0xf] = (RTCHitN)auVar221[0xf];
                        local_400[0x10] = (RTCHitN)auVar221[0x10];
                        local_400[0x11] = (RTCHitN)auVar221[0x11];
                        local_400[0x12] = (RTCHitN)auVar221[0x12];
                        local_400[0x13] = (RTCHitN)auVar221[0x13];
                        local_400[0x14] = (RTCHitN)auVar221[0x14];
                        local_400[0x15] = (RTCHitN)auVar221[0x15];
                        local_400[0x16] = (RTCHitN)auVar221[0x16];
                        local_400[0x17] = (RTCHitN)auVar221[0x17];
                        local_400[0x18] = (RTCHitN)auVar221[0x18];
                        local_400[0x19] = (RTCHitN)auVar221[0x19];
                        local_400[0x1a] = (RTCHitN)auVar221[0x1a];
                        local_400[0x1b] = (RTCHitN)auVar221[0x1b];
                        local_400[0x1c] = (RTCHitN)auVar221[0x1c];
                        local_400[0x1d] = (RTCHitN)auVar221[0x1d];
                        local_400[0x1e] = (RTCHitN)auVar221[0x1e];
                        local_400[0x1f] = (RTCHitN)auVar221[0x1f];
                        local_400[0x20] = (RTCHitN)auVar221[0x20];
                        local_400[0x21] = (RTCHitN)auVar221[0x21];
                        local_400[0x22] = (RTCHitN)auVar221[0x22];
                        local_400[0x23] = (RTCHitN)auVar221[0x23];
                        local_400[0x24] = (RTCHitN)auVar221[0x24];
                        local_400[0x25] = (RTCHitN)auVar221[0x25];
                        local_400[0x26] = (RTCHitN)auVar221[0x26];
                        local_400[0x27] = (RTCHitN)auVar221[0x27];
                        local_400[0x28] = (RTCHitN)auVar221[0x28];
                        local_400[0x29] = (RTCHitN)auVar221[0x29];
                        local_400[0x2a] = (RTCHitN)auVar221[0x2a];
                        local_400[0x2b] = (RTCHitN)auVar221[0x2b];
                        local_400[0x2c] = (RTCHitN)auVar221[0x2c];
                        local_400[0x2d] = (RTCHitN)auVar221[0x2d];
                        local_400[0x2e] = (RTCHitN)auVar221[0x2e];
                        local_400[0x2f] = (RTCHitN)auVar221[0x2f];
                        local_400[0x30] = (RTCHitN)auVar221[0x30];
                        local_400[0x31] = (RTCHitN)auVar221[0x31];
                        local_400[0x32] = (RTCHitN)auVar221[0x32];
                        local_400[0x33] = (RTCHitN)auVar221[0x33];
                        local_400[0x34] = (RTCHitN)auVar221[0x34];
                        local_400[0x35] = (RTCHitN)auVar221[0x35];
                        local_400[0x36] = (RTCHitN)auVar221[0x36];
                        local_400[0x37] = (RTCHitN)auVar221[0x37];
                        local_400[0x38] = (RTCHitN)auVar221[0x38];
                        local_400[0x39] = (RTCHitN)auVar221[0x39];
                        local_400[0x3a] = (RTCHitN)auVar221[0x3a];
                        local_400[0x3b] = (RTCHitN)auVar221[0x3b];
                        local_400[0x3c] = (RTCHitN)auVar221[0x3c];
                        local_400[0x3d] = (RTCHitN)auVar221[0x3d];
                        local_400[0x3e] = (RTCHitN)auVar221[0x3e];
                        local_400[0x3f] = (RTCHitN)auVar221[0x3f];
                        local_300 = 0;
                        uStack_2f8 = 0;
                        uStack_2f0 = 0;
                        uStack_2e8 = 0;
                        uStack_2e0 = 0;
                        uStack_2d8 = 0;
                        uStack_2d0 = 0;
                        uStack_2c8 = 0;
                        local_2c0 = local_440._0_8_;
                        uStack_2b8 = local_440._8_8_;
                        uStack_2b0 = local_440._16_8_;
                        uStack_2a8 = local_440._24_8_;
                        uStack_2a0 = local_440._32_8_;
                        uStack_298 = local_440._40_8_;
                        uStack_290 = local_440._48_8_;
                        uStack_288 = local_440._56_8_;
                        auVar221 = vmovdqa64_avx512f(local_480);
                        local_280 = vmovdqa64_avx512f(auVar221);
                        vpcmpeqd_avx2(auVar221._0_32_,auVar221._0_32_);
                        local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                        local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                        *(float *)(ray + k * 4 + 0x200) = fVar270;
                        local_700 = local_4c0;
                        local_9b0.valid = (int *)local_700;
                        local_9b0.geometryUserPtr = pGVar4->userPtr;
                        local_9b0.context = context->user;
                        local_9b0.hit = local_400;
                        local_9b0.N = 0x10;
                        local_9b0.ray = (RTCRayN *)ray;
                        if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar250 = ZEXT464((uint)fVar272);
                          auVar267 = ZEXT1664(auVar266);
                          auVar269 = ZEXT1664(auVar162);
                          auVar283 = ZEXT1664(local_920._0_16_);
                          (*pGVar4->occlusionFilterN)(&local_9b0);
                          auVar279 = ZEXT1664(ZEXT416((uint)fVar270));
                          auVar174 = ZEXT1664(auVar79);
                          auVar288 = ZEXT3264(local_980);
                          auVar275 = ZEXT3264(_local_960);
                        }
                        auVar143 = vmovdqa64_avx512f(local_700);
                        uVar17 = vptestmd_avx512f(auVar143,auVar143);
                        if ((short)uVar17 == 0) {
                          bVar60 = false;
                        }
                        else {
                          p_Var8 = context->args->filter;
                          if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar250 = ZEXT1664(auVar250._0_16_);
                            auVar267 = ZEXT1664(auVar267._0_16_);
                            auVar269 = ZEXT1664(auVar269._0_16_);
                            auVar283 = ZEXT1664(auVar283._0_16_);
                            (*p_Var8)(&local_9b0);
                            auVar279 = ZEXT1664(ZEXT416((uint)fVar270));
                            auVar174 = ZEXT1664(auVar79);
                            auVar288 = ZEXT3264(local_980);
                            auVar275 = ZEXT3264(_local_960);
                          }
                          auVar221 = vmovdqa64_avx512f(local_700);
                          uVar70 = vptestmd_avx512f(auVar221,auVar221);
                          auVar221 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                          bVar68 = (bool)((byte)uVar70 & 1);
                          auVar143._0_4_ =
                               (uint)bVar68 * auVar221._0_4_ |
                               (uint)!bVar68 * *(int *)(local_9b0.ray + 0x200);
                          bVar68 = (bool)((byte)(uVar70 >> 1) & 1);
                          auVar143._4_4_ =
                               (uint)bVar68 * auVar221._4_4_ |
                               (uint)!bVar68 * *(int *)(local_9b0.ray + 0x204);
                          bVar68 = (bool)((byte)(uVar70 >> 2) & 1);
                          auVar143._8_4_ =
                               (uint)bVar68 * auVar221._8_4_ |
                               (uint)!bVar68 * *(int *)(local_9b0.ray + 0x208);
                          bVar68 = (bool)((byte)(uVar70 >> 3) & 1);
                          auVar143._12_4_ =
                               (uint)bVar68 * auVar221._12_4_ |
                               (uint)!bVar68 * *(int *)(local_9b0.ray + 0x20c);
                          bVar68 = (bool)((byte)(uVar70 >> 4) & 1);
                          auVar143._16_4_ =
                               (uint)bVar68 * auVar221._16_4_ |
                               (uint)!bVar68 * *(int *)(local_9b0.ray + 0x210);
                          bVar68 = (bool)((byte)(uVar70 >> 5) & 1);
                          auVar143._20_4_ =
                               (uint)bVar68 * auVar221._20_4_ |
                               (uint)!bVar68 * *(int *)(local_9b0.ray + 0x214);
                          bVar68 = (bool)((byte)(uVar70 >> 6) & 1);
                          auVar143._24_4_ =
                               (uint)bVar68 * auVar221._24_4_ |
                               (uint)!bVar68 * *(int *)(local_9b0.ray + 0x218);
                          bVar68 = (bool)((byte)(uVar70 >> 7) & 1);
                          auVar143._28_4_ =
                               (uint)bVar68 * auVar221._28_4_ |
                               (uint)!bVar68 * *(int *)(local_9b0.ray + 0x21c);
                          bVar68 = (bool)((byte)(uVar70 >> 8) & 1);
                          auVar143._32_4_ =
                               (uint)bVar68 * auVar221._32_4_ |
                               (uint)!bVar68 * *(int *)(local_9b0.ray + 0x220);
                          bVar68 = (bool)((byte)(uVar70 >> 9) & 1);
                          auVar143._36_4_ =
                               (uint)bVar68 * auVar221._36_4_ |
                               (uint)!bVar68 * *(int *)(local_9b0.ray + 0x224);
                          bVar68 = (bool)((byte)(uVar70 >> 10) & 1);
                          auVar143._40_4_ =
                               (uint)bVar68 * auVar221._40_4_ |
                               (uint)!bVar68 * *(int *)(local_9b0.ray + 0x228);
                          bVar68 = (bool)((byte)(uVar70 >> 0xb) & 1);
                          auVar143._44_4_ =
                               (uint)bVar68 * auVar221._44_4_ |
                               (uint)!bVar68 * *(int *)(local_9b0.ray + 0x22c);
                          bVar68 = (bool)((byte)(uVar70 >> 0xc) & 1);
                          auVar143._48_4_ =
                               (uint)bVar68 * auVar221._48_4_ |
                               (uint)!bVar68 * *(int *)(local_9b0.ray + 0x230);
                          bVar68 = (bool)((byte)(uVar70 >> 0xd) & 1);
                          auVar143._52_4_ =
                               (uint)bVar68 * auVar221._52_4_ |
                               (uint)!bVar68 * *(int *)(local_9b0.ray + 0x234);
                          bVar68 = (bool)((byte)(uVar70 >> 0xe) & 1);
                          auVar143._56_4_ =
                               (uint)bVar68 * auVar221._56_4_ |
                               (uint)!bVar68 * *(int *)(local_9b0.ray + 0x238);
                          bVar68 = SUB81(uVar70 >> 0xf,0);
                          auVar143._60_4_ =
                               (uint)bVar68 * auVar221._60_4_ |
                               (uint)!bVar68 * *(int *)(local_9b0.ray + 0x23c);
                          *(undefined1 (*) [64])(local_9b0.ray + 0x200) = auVar143;
                          bVar60 = (short)uVar70 != 0;
                        }
                        if ((bool)bVar60 == false) {
                          *(float *)(ray + k * 4 + 0x200) = fVar271;
                        }
                      }
                      bVar68 = false;
                      goto LAB_01c43681;
                    }
                  }
                  bVar68 = false;
                  bVar60 = 0;
                }
              }
LAB_01c43681:
              if (!bVar68) goto LAB_01c43a7d;
              lVar66 = lVar66 + -1;
            } while (lVar66 != 0);
            bVar60 = 0;
LAB_01c43a7d:
            bVar62 = bVar62 | bVar60 & 1;
            auVar52._4_4_ = fStack_69c;
            auVar52._0_4_ = local_6a0;
            auVar52._8_4_ = fStack_698;
            auVar52._12_4_ = fStack_694;
            auVar52._16_4_ = fStack_690;
            auVar52._20_4_ = fStack_68c;
            auVar52._24_4_ = fStack_688;
            auVar52._28_4_ = fStack_684;
            uVar2 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar37._4_4_ = uVar2;
            auVar37._0_4_ = uVar2;
            auVar37._8_4_ = uVar2;
            auVar37._12_4_ = uVar2;
            auVar37._16_4_ = uVar2;
            auVar37._20_4_ = uVar2;
            auVar37._24_4_ = uVar2;
            auVar37._28_4_ = uVar2;
            uVar17 = vcmpps_avx512vl(auVar52,auVar37,2);
            bVar61 = bVar63 & bVar61 & (byte)uVar17;
          } while (bVar61 != 0);
        }
        uVar18 = vpcmpd_avx512vl(local_620,_local_6c0,1);
        uVar19 = vpcmpd_avx512vl(local_620,local_5a0,1);
        auVar199._0_4_ = auVar275._0_4_ + (float)local_500._0_4_;
        auVar199._4_4_ = auVar275._4_4_ + (float)local_500._4_4_;
        auVar199._8_4_ = auVar275._8_4_ + fStack_4f8;
        auVar199._12_4_ = auVar275._12_4_ + fStack_4f4;
        auVar199._16_4_ = auVar275._16_4_ + fStack_4f0;
        auVar199._20_4_ = auVar275._20_4_ + fStack_4ec;
        auVar199._24_4_ = auVar275._24_4_ + fStack_4e8;
        auVar199._28_4_ = auVar275._28_4_ + fStack_4e4;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar220._4_4_ = uVar2;
        auVar220._0_4_ = uVar2;
        auVar220._8_4_ = uVar2;
        auVar220._12_4_ = uVar2;
        auVar220._16_4_ = uVar2;
        auVar220._20_4_ = uVar2;
        auVar220._24_4_ = uVar2;
        auVar220._28_4_ = uVar2;
        uVar17 = vcmpps_avx512vl(auVar199,auVar220,2);
        bVar56 = bVar56 & (byte)uVar19 & (byte)uVar17;
        auVar235._0_4_ = auVar275._0_4_ + local_5e0._0_4_;
        auVar235._4_4_ = auVar275._4_4_ + local_5e0._4_4_;
        auVar235._8_4_ = auVar275._8_4_ + local_5e0._8_4_;
        auVar235._12_4_ = auVar275._12_4_ + local_5e0._12_4_;
        auVar235._16_4_ = auVar275._16_4_ + local_5e0._16_4_;
        auVar235._20_4_ = auVar275._20_4_ + local_5e0._20_4_;
        auVar235._24_4_ = auVar275._24_4_ + local_5e0._24_4_;
        auVar235._28_4_ = auVar275._28_4_ + local_5e0._28_4_;
        uVar17 = vcmpps_avx512vl(auVar235,auVar220,2);
        bVar54 = bVar54 & (byte)uVar18 & (byte)uVar17 | bVar56;
        if (bVar54 == 0) {
          auVar236 = ZEXT3264(_DAT_02020f20);
          auVar221 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                         &
                                                  DAT_3f8000003f800000)))))));
        }
        else {
          abStack_1a0[uVar57 * 0x60] = bVar54;
          auVar137._0_4_ =
               (uint)(bVar56 & 1) * local_500._0_4_ |
               (uint)!(bool)(bVar56 & 1) * (int)local_5e0._0_4_;
          bVar68 = (bool)(bVar56 >> 1 & 1);
          auVar137._4_4_ = (uint)bVar68 * local_500._4_4_ | (uint)!bVar68 * (int)local_5e0._4_4_;
          bVar68 = (bool)(bVar56 >> 2 & 1);
          auVar137._8_4_ = (uint)bVar68 * (int)fStack_4f8 | (uint)!bVar68 * (int)local_5e0._8_4_;
          bVar68 = (bool)(bVar56 >> 3 & 1);
          auVar137._12_4_ = (uint)bVar68 * (int)fStack_4f4 | (uint)!bVar68 * (int)local_5e0._12_4_;
          bVar68 = (bool)(bVar56 >> 4 & 1);
          auVar137._16_4_ = (uint)bVar68 * (int)fStack_4f0 | (uint)!bVar68 * (int)local_5e0._16_4_;
          bVar68 = (bool)(bVar56 >> 5 & 1);
          auVar137._20_4_ = (uint)bVar68 * (int)fStack_4ec | (uint)!bVar68 * (int)local_5e0._20_4_;
          auVar137._24_4_ =
               (uint)(bVar56 >> 6) * (int)fStack_4e8 |
               (uint)!(bool)(bVar56 >> 6) * (int)local_5e0._24_4_;
          auVar137._28_4_ = local_5e0._28_4_;
          auVar143._0_32_ = auVar137;
          *(undefined1 (*) [32])(auStack_180 + uVar57 * 0x60) = auVar137;
          uVar17 = vmovlps_avx(local_850);
          *(undefined8 *)(afStack_160 + uVar57 * 0x18) = uVar17;
          aiStack_158[uVar57 * 0x18] = iVar64 + 1;
          auVar236 = ZEXT3264(_DAT_02020f20);
          auVar221 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                         &
                                                  DAT_3f8000003f800000)))))));
          uVar57 = (ulong)((int)uVar57 + 1);
        }
      }
    }
    do {
      if ((int)uVar57 == 0) {
        if (bVar62 != 0) {
          return local_c71;
        }
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar28._4_4_ = uVar2;
        auVar28._0_4_ = uVar2;
        auVar28._8_4_ = uVar2;
        auVar28._12_4_ = uVar2;
        uVar17 = vcmpps_avx512vl(local_630,auVar28,2);
        uVar58 = (uint)uVar17 & (uint)local_7a8 - 1 & (uint)local_7a8;
        local_7a8 = (ulong)uVar58;
        local_c71 = uVar58 != 0;
        if (!local_c71) {
          return local_c71;
        }
        goto LAB_01c412ad;
      }
      uVar59 = (ulong)((int)uVar57 - 1);
      lVar66 = uVar59 * 0x60;
      auVar135 = *(undefined1 (*) [32])(auStack_180 + lVar66);
      auVar200._0_4_ = auVar275._0_4_ + auVar135._0_4_;
      auVar200._4_4_ = auVar275._4_4_ + auVar135._4_4_;
      auVar200._8_4_ = auVar275._8_4_ + auVar135._8_4_;
      auVar200._12_4_ = auVar275._12_4_ + auVar135._12_4_;
      auVar200._16_4_ = auVar275._16_4_ + auVar135._16_4_;
      auVar200._20_4_ = auVar275._20_4_ + auVar135._20_4_;
      auVar200._24_4_ = auVar275._24_4_ + auVar135._24_4_;
      auVar200._28_4_ = auVar275._28_4_ + auVar135._28_4_;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar38._4_4_ = uVar2;
      auVar38._0_4_ = uVar2;
      auVar38._8_4_ = uVar2;
      auVar38._12_4_ = uVar2;
      auVar38._16_4_ = uVar2;
      auVar38._20_4_ = uVar2;
      auVar38._24_4_ = uVar2;
      auVar38._28_4_ = uVar2;
      uVar17 = vcmpps_avx512vl(auVar200,auVar38,2);
      uVar71 = (uint)uVar17 & (uint)abStack_1a0[lVar66];
      bVar54 = (byte)uVar71;
      uVar70 = uVar59;
      if (uVar71 != 0) {
        auVar201._8_4_ = 0x7f800000;
        auVar201._0_8_ = 0x7f8000007f800000;
        auVar201._12_4_ = 0x7f800000;
        auVar201._16_4_ = 0x7f800000;
        auVar201._20_4_ = 0x7f800000;
        auVar201._24_4_ = 0x7f800000;
        auVar201._28_4_ = 0x7f800000;
        auVar104 = vblendmps_avx512vl(auVar201,auVar135);
        auVar138._0_4_ =
             (uint)(bVar54 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar54 & 1) * (int)auVar135._0_4_;
        bVar68 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar138._4_4_ = (uint)bVar68 * auVar104._4_4_ | (uint)!bVar68 * (int)auVar135._4_4_;
        bVar68 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar138._8_4_ = (uint)bVar68 * auVar104._8_4_ | (uint)!bVar68 * (int)auVar135._8_4_;
        bVar68 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar138._12_4_ = (uint)bVar68 * auVar104._12_4_ | (uint)!bVar68 * (int)auVar135._12_4_;
        bVar68 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar138._16_4_ = (uint)bVar68 * auVar104._16_4_ | (uint)!bVar68 * (int)auVar135._16_4_;
        bVar68 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar138._20_4_ = (uint)bVar68 * auVar104._20_4_ | (uint)!bVar68 * (int)auVar135._20_4_;
        bVar68 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar138._24_4_ = (uint)bVar68 * auVar104._24_4_ | (uint)!bVar68 * (int)auVar135._24_4_;
        auVar138._28_4_ =
             (uVar71 >> 7) * auVar104._28_4_ | (uint)!SUB41(uVar71 >> 7,0) * (int)auVar135._28_4_;
        auVar143._0_32_ = auVar138;
        auVar135 = vshufps_avx(auVar138,auVar138,0xb1);
        auVar135 = vminps_avx(auVar138,auVar135);
        auVar104 = vshufpd_avx(auVar135,auVar135,5);
        auVar135 = vminps_avx(auVar135,auVar104);
        auVar104 = vpermpd_avx2(auVar135,0x4e);
        auVar135 = vminps_avx(auVar135,auVar104);
        uVar17 = vcmpps_avx512vl(auVar138,auVar135,0);
        bVar61 = (byte)uVar17 & bVar54;
        if (bVar61 != 0) {
          uVar71 = (uint)bVar61;
        }
        fVar268 = afStack_160[uVar59 * 0x18 + 1];
        uVar144 = 0;
        for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
          uVar144 = uVar144 + 1;
        }
        iVar64 = aiStack_158[uVar59 * 0x18];
        bVar61 = ~('\x01' << ((byte)uVar144 & 0x1f)) & bVar54;
        abStack_1a0[lVar66] = bVar61;
        auVar221 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
        if (bVar61 != 0) {
          uVar70 = uVar57;
        }
        fVar270 = afStack_160[uVar59 * 0x18];
        auVar202._4_4_ = fVar270;
        auVar202._0_4_ = fVar270;
        auVar202._8_4_ = fVar270;
        auVar202._12_4_ = fVar270;
        auVar202._16_4_ = fVar270;
        auVar202._20_4_ = fVar270;
        auVar202._24_4_ = fVar270;
        auVar202._28_4_ = fVar270;
        fVar268 = fVar268 - fVar270;
        auVar173._4_4_ = fVar268;
        auVar173._0_4_ = fVar268;
        auVar173._8_4_ = fVar268;
        auVar173._12_4_ = fVar268;
        auVar173._16_4_ = fVar268;
        auVar173._20_4_ = fVar268;
        auVar173._24_4_ = fVar268;
        auVar173._28_4_ = fVar268;
        auVar78 = vfmadd132ps_fma(auVar173,auVar202,auVar236._0_32_);
        auVar135 = ZEXT1632(auVar78);
        local_400[0] = (RTCHitN)auVar135[0];
        local_400[1] = (RTCHitN)auVar135[1];
        local_400[2] = (RTCHitN)auVar135[2];
        local_400[3] = (RTCHitN)auVar135[3];
        local_400[4] = (RTCHitN)auVar135[4];
        local_400[5] = (RTCHitN)auVar135[5];
        local_400[6] = (RTCHitN)auVar135[6];
        local_400[7] = (RTCHitN)auVar135[7];
        local_400[8] = (RTCHitN)auVar135[8];
        local_400[9] = (RTCHitN)auVar135[9];
        local_400[10] = (RTCHitN)auVar135[10];
        local_400[0xb] = (RTCHitN)auVar135[0xb];
        local_400[0xc] = (RTCHitN)auVar135[0xc];
        local_400[0xd] = (RTCHitN)auVar135[0xd];
        local_400[0xe] = (RTCHitN)auVar135[0xe];
        local_400[0xf] = (RTCHitN)auVar135[0xf];
        local_400[0x10] = (RTCHitN)auVar135[0x10];
        local_400[0x11] = (RTCHitN)auVar135[0x11];
        local_400[0x12] = (RTCHitN)auVar135[0x12];
        local_400[0x13] = (RTCHitN)auVar135[0x13];
        local_400[0x14] = (RTCHitN)auVar135[0x14];
        local_400[0x15] = (RTCHitN)auVar135[0x15];
        local_400[0x16] = (RTCHitN)auVar135[0x16];
        local_400[0x17] = (RTCHitN)auVar135[0x17];
        local_400[0x18] = (RTCHitN)auVar135[0x18];
        local_400[0x19] = (RTCHitN)auVar135[0x19];
        local_400[0x1a] = (RTCHitN)auVar135[0x1a];
        local_400[0x1b] = (RTCHitN)auVar135[0x1b];
        local_400[0x1c] = (RTCHitN)auVar135[0x1c];
        local_400[0x1d] = (RTCHitN)auVar135[0x1d];
        local_400[0x1e] = (RTCHitN)auVar135[0x1e];
        local_400[0x1f] = (RTCHitN)auVar135[0x1f];
        local_850._8_8_ = 0;
        local_850._0_8_ = *(ulong *)(local_400 + (ulong)uVar144 * 4);
      }
      uVar57 = uVar70;
    } while (bVar54 == 0);
    auVar135 = auVar143._32_32_;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }